

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiMBIntersectorK<8,8>::
     occluded_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [28];
  undefined1 auVar96 [28];
  undefined1 auVar97 [32];
  undefined1 auVar98 [24];
  byte bVar99;
  uint uVar100;
  int iVar101;
  ulong uVar102;
  long lVar103;
  ulong uVar104;
  uint uVar105;
  bool bVar106;
  ulong uVar107;
  Geometry *geometry;
  long lVar108;
  undefined4 uVar109;
  undefined8 uVar110;
  float fVar125;
  undefined1 auVar111 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar113 [32];
  undefined1 auVar112 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar124;
  float fVar126;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar132 [16];
  float fVar130;
  undefined8 uVar131;
  undefined1 auVar134 [32];
  undefined1 auVar133 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar143;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar144;
  float fVar146;
  float fVar166;
  undefined1 auVar147 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar158 [32];
  float fVar145;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar159 [32];
  undefined1 auVar152 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [64];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar203 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar208 [32];
  float fVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  float fVar222;
  float fVar223;
  undefined1 auVar220 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar221 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  RTCFilterFunctionNArguments args;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  LinearSpace3fa *local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  ulong local_5e0;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  float local_5c0;
  uint uStack_5bc;
  uint uStack_5b8;
  uint uStack_5b4;
  uint uStack_5b0;
  uint uStack_5ac;
  uint uStack_5a8;
  uint uStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  int local_340;
  int local_33c;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar160 [32];
  
  PVar14 = prim[1];
  uVar102 = (ulong)(byte)PVar14;
  lVar24 = uVar102 * 0x25;
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar22 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar22 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar146 = *(float *)(prim + lVar24 + 0x12);
  auVar21 = vsubps_avx(auVar21,*(undefined1 (*) [16])(prim + lVar24 + 6));
  auVar111._0_4_ = fVar146 * auVar21._0_4_;
  auVar111._4_4_ = fVar146 * auVar21._4_4_;
  auVar111._8_4_ = fVar146 * auVar21._8_4_;
  auVar111._12_4_ = fVar146 * auVar21._12_4_;
  auVar147._0_4_ = fVar146 * auVar22._0_4_;
  auVar147._4_4_ = fVar146 * auVar22._4_4_;
  auVar147._8_4_ = fVar146 * auVar22._8_4_;
  auVar147._12_4_ = fVar146 * auVar22._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar102 * 4 + 6);
  auVar134 = vpmovsxbd_avx2(auVar21);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar102 * 5 + 6);
  auVar135 = vpmovsxbd_avx2(auVar22);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar102 * 6 + 6);
  auVar120 = vpmovsxbd_avx2(auVar7);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar102 * 0xf + 6);
  auVar140 = vpmovsxbd_avx2(auVar8);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  auVar123 = vpmovsxbd_avx2(auVar9);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar102 + 6);
  auVar23 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar102 * 0x1a + 6);
  auVar200 = vpmovsxbd_avx2(auVar11);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar102 * 0x1b + 6);
  auVar162 = vpmovsxbd_avx2(auVar12);
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar102 * 0x1c + 6);
  auVar122 = vpmovsxbd_avx2(auVar13);
  auVar20 = vcvtdq2ps_avx(auVar162);
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar215._4_4_ = auVar147._0_4_;
  auVar215._0_4_ = auVar147._0_4_;
  auVar215._8_4_ = auVar147._0_4_;
  auVar215._12_4_ = auVar147._0_4_;
  auVar215._16_4_ = auVar147._0_4_;
  auVar215._20_4_ = auVar147._0_4_;
  auVar215._24_4_ = auVar147._0_4_;
  auVar215._28_4_ = auVar147._0_4_;
  auVar21 = vmovshdup_avx(auVar147);
  uVar110 = auVar21._0_8_;
  auVar228._8_8_ = uVar110;
  auVar228._0_8_ = uVar110;
  auVar228._16_8_ = uVar110;
  auVar228._24_8_ = uVar110;
  auVar21 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar146 = auVar21._0_4_;
  auVar165._0_4_ = fVar146 * auVar120._0_4_;
  fVar145 = auVar21._4_4_;
  auVar165._4_4_ = fVar145 * auVar120._4_4_;
  auVar165._8_4_ = fVar146 * auVar120._8_4_;
  auVar165._12_4_ = fVar145 * auVar120._12_4_;
  auVar165._16_4_ = fVar146 * auVar120._16_4_;
  auVar165._20_4_ = fVar145 * auVar120._20_4_;
  auVar165._28_36_ = in_ZMM10._28_36_;
  auVar165._24_4_ = fVar146 * auVar120._24_4_;
  auVar187._4_4_ = auVar23._4_4_ * fVar145;
  auVar187._0_4_ = auVar23._0_4_ * fVar146;
  auVar187._8_4_ = auVar23._8_4_ * fVar146;
  auVar187._12_4_ = auVar23._12_4_ * fVar145;
  auVar187._16_4_ = auVar23._16_4_ * fVar146;
  auVar187._20_4_ = auVar23._20_4_ * fVar145;
  auVar187._24_4_ = auVar23._24_4_ * fVar146;
  auVar187._28_4_ = auVar162._28_4_;
  auVar195._0_4_ = auVar122._0_4_ * fVar146;
  auVar195._4_4_ = auVar122._4_4_ * fVar145;
  auVar195._8_4_ = auVar122._8_4_ * fVar146;
  auVar195._12_4_ = auVar122._12_4_ * fVar145;
  auVar195._16_4_ = auVar122._16_4_ * fVar146;
  auVar195._20_4_ = auVar122._20_4_ * fVar145;
  auVar195._24_4_ = auVar122._24_4_ * fVar146;
  auVar195._28_4_ = 0;
  auVar21 = vfmadd231ps_fma(auVar165._0_32_,auVar228,auVar135);
  auVar22 = vfmadd231ps_fma(auVar187,auVar228,auVar123);
  auVar7 = vfmadd231ps_fma(auVar195,auVar20,auVar228);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar215,auVar134);
  auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar215,auVar140);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar200,auVar215);
  auVar216._4_4_ = auVar111._0_4_;
  auVar216._0_4_ = auVar111._0_4_;
  auVar216._8_4_ = auVar111._0_4_;
  auVar216._12_4_ = auVar111._0_4_;
  auVar216._16_4_ = auVar111._0_4_;
  auVar216._20_4_ = auVar111._0_4_;
  auVar216._24_4_ = auVar111._0_4_;
  auVar216._28_4_ = auVar111._0_4_;
  auVar21 = vmovshdup_avx(auVar111);
  uVar110 = auVar21._0_8_;
  auVar229._8_8_ = uVar110;
  auVar229._0_8_ = uVar110;
  auVar229._16_8_ = uVar110;
  auVar229._24_8_ = uVar110;
  auVar21 = vshufps_avx(auVar111,auVar111,0xaa);
  fVar146 = auVar21._0_4_;
  auVar156._0_4_ = fVar146 * auVar120._0_4_;
  fVar145 = auVar21._4_4_;
  auVar156._4_4_ = fVar145 * auVar120._4_4_;
  auVar156._8_4_ = fVar146 * auVar120._8_4_;
  auVar156._12_4_ = fVar145 * auVar120._12_4_;
  auVar156._16_4_ = fVar146 * auVar120._16_4_;
  auVar156._20_4_ = fVar145 * auVar120._20_4_;
  auVar156._24_4_ = fVar146 * auVar120._24_4_;
  auVar156._28_4_ = 0;
  auVar162._4_4_ = auVar23._4_4_ * fVar145;
  auVar162._0_4_ = auVar23._0_4_ * fVar146;
  auVar162._8_4_ = auVar23._8_4_ * fVar146;
  auVar162._12_4_ = auVar23._12_4_ * fVar145;
  auVar162._16_4_ = auVar23._16_4_ * fVar146;
  auVar162._20_4_ = auVar23._20_4_ * fVar145;
  auVar162._24_4_ = auVar23._24_4_ * fVar146;
  auVar162._28_4_ = auVar120._28_4_;
  auVar120._4_4_ = auVar122._4_4_ * fVar145;
  auVar120._0_4_ = auVar122._0_4_ * fVar146;
  auVar120._8_4_ = auVar122._8_4_ * fVar146;
  auVar120._12_4_ = auVar122._12_4_ * fVar145;
  auVar120._16_4_ = auVar122._16_4_ * fVar146;
  auVar120._20_4_ = auVar122._20_4_ * fVar145;
  auVar120._24_4_ = auVar122._24_4_ * fVar146;
  auVar120._28_4_ = fVar145;
  auVar21 = vfmadd231ps_fma(auVar156,auVar229,auVar135);
  auVar9 = vfmadd231ps_fma(auVar162,auVar229,auVar123);
  auVar10 = vfmadd231ps_fma(auVar120,auVar229,auVar20);
  auVar111 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar216,auVar134);
  local_3c0._8_4_ = 0x7fffffff;
  local_3c0._0_8_ = 0x7fffffff7fffffff;
  local_3c0._12_4_ = 0x7fffffff;
  local_3c0._16_4_ = 0x7fffffff;
  local_3c0._20_4_ = 0x7fffffff;
  local_3c0._24_4_ = 0x7fffffff;
  local_3c0._28_4_ = 0x7fffffff;
  auVar170._8_4_ = 0x219392ef;
  auVar170._0_8_ = 0x219392ef219392ef;
  auVar170._12_4_ = 0x219392ef;
  auVar170._16_4_ = 0x219392ef;
  auVar170._20_4_ = 0x219392ef;
  auVar170._24_4_ = 0x219392ef;
  auVar170._28_4_ = 0x219392ef;
  auVar134 = vandps_avx(ZEXT1632(auVar8),local_3c0);
  auVar134 = vcmpps_avx(auVar134,auVar170,1);
  auVar135 = vblendvps_avx(ZEXT1632(auVar8),auVar170,auVar134);
  auVar134 = vandps_avx(ZEXT1632(auVar22),local_3c0);
  auVar134 = vcmpps_avx(auVar134,auVar170,1);
  auVar120 = vblendvps_avx(ZEXT1632(auVar22),auVar170,auVar134);
  auVar134 = vandps_avx(ZEXT1632(auVar7),local_3c0);
  auVar134 = vcmpps_avx(auVar134,auVar170,1);
  auVar134 = vblendvps_avx(ZEXT1632(auVar7),auVar170,auVar134);
  auVar147 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar216,auVar140);
  auVar140 = vrcpps_avx(auVar135);
  auVar112 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar216,auVar200);
  auVar196._8_4_ = 0x3f800000;
  auVar196._0_8_ = 0x3f8000003f800000;
  auVar196._12_4_ = 0x3f800000;
  auVar196._16_4_ = 0x3f800000;
  auVar196._20_4_ = 0x3f800000;
  auVar196._24_4_ = 0x3f800000;
  auVar196._28_4_ = 0x3f800000;
  auVar21 = vfnmadd213ps_fma(auVar135,auVar140,auVar196);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar140,auVar140);
  auVar135 = vrcpps_avx(auVar120);
  auVar22 = vfnmadd213ps_fma(auVar120,auVar135,auVar196);
  auVar120 = vrcpps_avx(auVar134);
  auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar135,auVar135);
  auVar7 = vfnmadd213ps_fma(auVar134,auVar120,auVar196);
  auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar120,auVar120);
  fVar146 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar24 + 0x16)) *
            *(float *)(prim + lVar24 + 0x1a);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 7 + 6));
  auVar171._4_4_ = fVar146;
  auVar171._0_4_ = fVar146;
  auVar171._8_4_ = fVar146;
  auVar171._12_4_ = fVar146;
  auVar171._16_4_ = fVar146;
  auVar171._20_4_ = fVar146;
  auVar171._24_4_ = fVar146;
  auVar171._28_4_ = fVar146;
  auVar135 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0xb + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,auVar134);
  auVar8 = vfmadd213ps_fma(auVar135,auVar171,auVar134);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 9 + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar135 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0xd + 6));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,auVar134);
  auVar9 = vfmadd213ps_fma(auVar135,auVar171,auVar134);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x12 + 6));
  uVar104 = (ulong)(uint)((int)(uVar102 * 5) << 2);
  auVar135 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 2 + uVar104 + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,auVar134);
  auVar10 = vfmadd213ps_fma(auVar135,auVar171,auVar134);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 + 6));
  auVar135 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x18 + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,auVar134);
  auVar11 = vfmadd213ps_fma(auVar135,auVar171,auVar134);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x1d + 6));
  auVar135 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 + (ulong)(byte)PVar14 * 0x20 + 6))
  ;
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,auVar134);
  auVar12 = vfmadd213ps_fma(auVar135,auVar171,auVar134);
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + ((ulong)(byte)PVar14 * 0x20 - uVar102) + 6));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar135 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x23 + 6));
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar135 = vsubps_avx(auVar135,auVar134);
  auVar13 = vfmadd213ps_fma(auVar135,auVar171,auVar134);
  auVar134 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar111));
  auVar140._4_4_ = auVar21._4_4_ * auVar134._4_4_;
  auVar140._0_4_ = auVar21._0_4_ * auVar134._0_4_;
  auVar140._8_4_ = auVar21._8_4_ * auVar134._8_4_;
  auVar140._12_4_ = auVar21._12_4_ * auVar134._12_4_;
  auVar140._16_4_ = auVar134._16_4_ * 0.0;
  auVar140._20_4_ = auVar134._20_4_ * 0.0;
  auVar140._24_4_ = auVar134._24_4_ * 0.0;
  auVar140._28_4_ = auVar134._28_4_;
  auVar134 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar111));
  auVar123._4_4_ = auVar21._4_4_ * auVar134._4_4_;
  auVar123._0_4_ = auVar21._0_4_ * auVar134._0_4_;
  auVar123._8_4_ = auVar21._8_4_ * auVar134._8_4_;
  auVar123._12_4_ = auVar21._12_4_ * auVar134._12_4_;
  auVar123._16_4_ = auVar134._16_4_ * 0.0;
  auVar123._20_4_ = auVar134._20_4_ * 0.0;
  auVar123._24_4_ = auVar134._24_4_ * 0.0;
  auVar123._28_4_ = auVar134._28_4_;
  auVar134 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar147));
  auVar23._4_4_ = auVar22._4_4_ * auVar134._4_4_;
  auVar23._0_4_ = auVar22._0_4_ * auVar134._0_4_;
  auVar23._8_4_ = auVar22._8_4_ * auVar134._8_4_;
  auVar23._12_4_ = auVar22._12_4_ * auVar134._12_4_;
  auVar23._16_4_ = auVar134._16_4_ * 0.0;
  auVar23._20_4_ = auVar134._20_4_ * 0.0;
  auVar23._24_4_ = auVar134._24_4_ * 0.0;
  auVar23._28_4_ = auVar134._28_4_;
  auVar134 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar147));
  auVar200._4_4_ = auVar22._4_4_ * auVar134._4_4_;
  auVar200._0_4_ = auVar22._0_4_ * auVar134._0_4_;
  auVar200._8_4_ = auVar22._8_4_ * auVar134._8_4_;
  auVar200._12_4_ = auVar22._12_4_ * auVar134._12_4_;
  auVar200._16_4_ = auVar134._16_4_ * 0.0;
  auVar200._20_4_ = auVar134._20_4_ * 0.0;
  auVar200._24_4_ = auVar134._24_4_ * 0.0;
  auVar200._28_4_ = auVar134._28_4_;
  auVar134 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar112));
  auVar20._4_4_ = auVar7._4_4_ * auVar134._4_4_;
  auVar20._0_4_ = auVar7._0_4_ * auVar134._0_4_;
  auVar20._8_4_ = auVar7._8_4_ * auVar134._8_4_;
  auVar20._12_4_ = auVar7._12_4_ * auVar134._12_4_;
  auVar20._16_4_ = auVar134._16_4_ * 0.0;
  auVar20._20_4_ = auVar134._20_4_ * 0.0;
  auVar20._24_4_ = auVar134._24_4_ * 0.0;
  auVar20._28_4_ = auVar134._28_4_;
  auVar134 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar112));
  auVar122._4_4_ = auVar7._4_4_ * auVar134._4_4_;
  auVar122._0_4_ = auVar7._0_4_ * auVar134._0_4_;
  auVar122._8_4_ = auVar7._8_4_ * auVar134._8_4_;
  auVar122._12_4_ = auVar7._12_4_ * auVar134._12_4_;
  auVar122._16_4_ = auVar134._16_4_ * 0.0;
  auVar122._20_4_ = auVar134._20_4_ * 0.0;
  auVar122._24_4_ = auVar134._24_4_ * 0.0;
  auVar122._28_4_ = auVar134._28_4_;
  auVar134 = vpminsd_avx2(auVar140,auVar123);
  auVar135 = vpminsd_avx2(auVar23,auVar200);
  auVar134 = vmaxps_avx(auVar134,auVar135);
  auVar135 = vpminsd_avx2(auVar20,auVar122);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar197._4_4_ = uVar109;
  auVar197._0_4_ = uVar109;
  auVar197._8_4_ = uVar109;
  auVar197._12_4_ = uVar109;
  auVar197._16_4_ = uVar109;
  auVar197._20_4_ = uVar109;
  auVar197._24_4_ = uVar109;
  auVar197._28_4_ = uVar109;
  auVar135 = vmaxps_avx(auVar135,auVar197);
  auVar134 = vmaxps_avx(auVar134,auVar135);
  local_80._4_4_ = auVar134._4_4_ * 0.99999964;
  local_80._0_4_ = auVar134._0_4_ * 0.99999964;
  local_80._8_4_ = auVar134._8_4_ * 0.99999964;
  local_80._12_4_ = auVar134._12_4_ * 0.99999964;
  local_80._16_4_ = auVar134._16_4_ * 0.99999964;
  local_80._20_4_ = auVar134._20_4_ * 0.99999964;
  local_80._24_4_ = auVar134._24_4_ * 0.99999964;
  local_80._28_4_ = auVar134._28_4_;
  auVar134 = vpmaxsd_avx2(auVar140,auVar123);
  auVar135 = vpmaxsd_avx2(auVar23,auVar200);
  auVar134 = vminps_avx(auVar134,auVar135);
  auVar135 = vpmaxsd_avx2(auVar20,auVar122);
  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar157._4_4_ = uVar109;
  auVar157._0_4_ = uVar109;
  auVar157._8_4_ = uVar109;
  auVar157._12_4_ = uVar109;
  auVar157._16_4_ = uVar109;
  auVar157._20_4_ = uVar109;
  auVar157._24_4_ = uVar109;
  auVar157._28_4_ = uVar109;
  auVar135 = vminps_avx(auVar135,auVar157);
  auVar134 = vminps_avx(auVar134,auVar135);
  auVar203._4_4_ = auVar134._4_4_ * 1.0000004;
  auVar203._0_4_ = auVar134._0_4_ * 1.0000004;
  auVar203._8_4_ = auVar134._8_4_ * 1.0000004;
  auVar203._12_4_ = auVar134._12_4_ * 1.0000004;
  auVar203._16_4_ = auVar134._16_4_ * 1.0000004;
  auVar203._20_4_ = auVar134._20_4_ * 1.0000004;
  auVar203._24_4_ = auVar134._24_4_ * 1.0000004;
  auVar203._28_4_ = auVar134._28_4_;
  auVar134._1_3_ = 0;
  auVar134[0] = PVar14;
  auVar134[4] = PVar14;
  auVar134._5_3_ = 0;
  auVar134[8] = PVar14;
  auVar134._9_3_ = 0;
  auVar134[0xc] = PVar14;
  auVar134._13_3_ = 0;
  auVar134[0x10] = PVar14;
  auVar134._17_3_ = 0;
  auVar134[0x14] = PVar14;
  auVar134._21_3_ = 0;
  auVar134[0x18] = PVar14;
  auVar134._25_3_ = 0;
  auVar134[0x1c] = PVar14;
  auVar134._29_3_ = 0;
  auVar135 = vpcmpgtd_avx2(auVar134,_DAT_01fe9900);
  auVar134 = vcmpps_avx(local_80,auVar203,2);
  auVar134 = vandps_avx(auVar134,auVar135);
  uVar100 = vmovmskps_avx(auVar134);
  if (uVar100 == 0) {
    bVar106 = false;
  }
  else {
    uVar100 = uVar100 & 0xff;
    local_648 = pre->ray_space + k;
    local_640 = mm_lookupmask_ps._16_8_;
    uStack_638 = mm_lookupmask_ps._24_8_;
    uStack_630 = mm_lookupmask_ps._16_8_;
    uStack_628 = mm_lookupmask_ps._24_8_;
    iVar101 = 1 << ((uint)k & 0x1f);
    auVar113._4_4_ = iVar101;
    auVar113._0_4_ = iVar101;
    auVar113._8_4_ = iVar101;
    auVar113._12_4_ = iVar101;
    auVar113._16_4_ = iVar101;
    auVar113._20_4_ = iVar101;
    auVar113._24_4_ = iVar101;
    auVar113._28_4_ = iVar101;
    auVar135 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar134 = vpand_avx2(auVar113,auVar135);
    local_3e0 = vpcmpeqd_avx2(auVar134,auVar135);
    local_3f0 = 0x7fffffff;
    uStack_3ec = 0x7fffffff;
    uStack_3e8 = 0x7fffffff;
    uStack_3e4 = 0x7fffffff;
    do {
      lVar24 = 0;
      for (uVar102 = (ulong)uVar100; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000
          ) {
        lVar24 = lVar24 + 1;
      }
      local_860._4_4_ = *(undefined4 *)(prim + 2);
      uStack_878._0_4_ = *(uint *)(prim + lVar24 * 4 + 6);
      local_5e0 = (ulong)(uint)uStack_878;
      pGVar15 = (context->scene->geometries).items[(uint)local_860._4_4_].ptr;
      uVar102 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                                local_5e0 *
                                pGVar15[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar146 = (pGVar15->time_range).lower;
      fVar146 = pGVar15->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar146) /
                ((pGVar15->time_range).upper - fVar146));
      auVar21 = vroundss_avx(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),9);
      auVar21 = vminss_avx(auVar21,ZEXT416((uint)(pGVar15->fnumTimeSegments + -1.0)));
      auVar21 = vmaxss_avx(ZEXT816(0) << 0x20,auVar21);
      fVar146 = fVar146 - auVar21._0_4_;
      fVar145 = 1.0 - fVar146;
      _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar103 = (long)(int)auVar21._0_4_ * 0x38;
      lVar108 = *(long *)(_Var16 + 0x10 + lVar103);
      lVar17 = *(long *)(_Var16 + 0x38 + lVar103);
      lVar18 = *(long *)(_Var16 + 0x48 + lVar103);
      pfVar1 = (float *)(lVar17 + lVar18 * uVar102);
      auVar148._0_4_ = fVar146 * *pfVar1;
      auVar148._4_4_ = fVar146 * pfVar1[1];
      auVar148._8_4_ = fVar146 * pfVar1[2];
      auVar148._12_4_ = fVar146 * pfVar1[3];
      lVar24 = uVar102 + 1;
      pfVar1 = (float *)(lVar17 + lVar18 * lVar24);
      auVar167._0_4_ = fVar146 * *pfVar1;
      auVar167._4_4_ = fVar146 * pfVar1[1];
      auVar167._8_4_ = fVar146 * pfVar1[2];
      auVar167._12_4_ = fVar146 * pfVar1[3];
      p_Var19 = pGVar15[4].occlusionFilterN;
      auVar112._4_4_ = fVar145;
      auVar112._0_4_ = fVar145;
      auVar112._8_4_ = fVar145;
      auVar112._12_4_ = fVar145;
      auVar12 = vfmadd231ps_fma(auVar148,auVar112,
                                *(undefined1 (*) [16])
                                 (*(long *)(_Var16 + lVar103) + lVar108 * uVar102));
      _local_660 = vfmadd231ps_fma(auVar167,auVar112,
                                   *(undefined1 (*) [16])
                                    (*(long *)(_Var16 + lVar103) + lVar108 * lVar24));
      pfVar1 = (float *)(*(long *)(p_Var19 + lVar103 + 0x38) +
                        uVar102 * *(long *)(p_Var19 + lVar103 + 0x48));
      auVar168._0_4_ = fVar146 * *pfVar1;
      auVar168._4_4_ = fVar146 * pfVar1[1];
      auVar168._8_4_ = fVar146 * pfVar1[2];
      auVar168._12_4_ = fVar146 * pfVar1[3];
      pfVar1 = (float *)(*(long *)(p_Var19 + lVar103 + 0x38) +
                        *(long *)(p_Var19 + lVar103 + 0x48) * lVar24);
      auVar132._0_4_ = fVar146 * *pfVar1;
      auVar132._4_4_ = fVar146 * pfVar1[1];
      auVar132._8_4_ = fVar146 * pfVar1[2];
      auVar132._12_4_ = fVar146 * pfVar1[3];
      auVar22 = vfmadd231ps_fma(auVar168,auVar112,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var19 + lVar103) +
                                 *(long *)(p_Var19 + lVar103 + 0x10) * uVar102));
      auVar7 = vfmadd231ps_fma(auVar132,auVar112,
                               *(undefined1 (*) [16])
                                (*(long *)(p_Var19 + lVar103) +
                                *(long *)(p_Var19 + lVar103 + 0x10) * lVar24));
      iVar101 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar24 = (long)iVar101 * 0x44;
      auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar8 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar133._8_4_ = 0xbeaaaaab;
      auVar133._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar133._12_4_ = 0xbeaaaaab;
      auVar132 = vfnmadd213ps_fma(auVar22,auVar133,auVar12);
      auVar11 = vfmadd213ps_fma(auVar7,auVar133,_local_660);
      auVar22 = vsubps_avx(auVar12,auVar8);
      uVar109 = auVar22._0_4_;
      auVar149._4_4_ = uVar109;
      auVar149._0_4_ = uVar109;
      auVar149._8_4_ = uVar109;
      auVar149._12_4_ = uVar109;
      auVar21 = vshufps_avx(auVar22,auVar22,0x55);
      auVar22 = vshufps_avx(auVar22,auVar22,0xaa);
      aVar4 = (local_648->vx).field_0;
      aVar5 = (local_648->vy).field_0;
      fVar146 = (local_648->vz).field_0.m128[0];
      fVar145 = *(float *)((long)&(local_648->vz).field_0 + 4);
      fVar124 = *(float *)((long)&(local_648->vz).field_0 + 8);
      fVar125 = *(float *)((long)&(local_648->vz).field_0 + 0xc);
      auVar220._0_4_ = fVar146 * auVar22._0_4_;
      auVar220._4_4_ = fVar145 * auVar22._4_4_;
      auVar220._8_4_ = fVar124 * auVar22._8_4_;
      auVar220._12_4_ = fVar125 * auVar22._12_4_;
      auVar21 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar5,auVar21);
      auVar13 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar4,auVar149);
      auVar21 = vblendps_avx(auVar13,auVar12,8);
      auVar7 = vsubps_avx(auVar132,auVar8);
      uVar109 = auVar7._0_4_;
      auVar169._4_4_ = uVar109;
      auVar169._0_4_ = uVar109;
      auVar169._8_4_ = uVar109;
      auVar169._12_4_ = uVar109;
      auVar22 = vshufps_avx(auVar7,auVar7,0x55);
      auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
      auVar202._0_4_ = fVar146 * auVar7._0_4_;
      auVar202._4_4_ = fVar145 * auVar7._4_4_;
      auVar202._8_4_ = fVar124 * auVar7._8_4_;
      auVar202._12_4_ = fVar125 * auVar7._12_4_;
      auVar22 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar5,auVar22);
      auVar111 = vfmadd231ps_fma(auVar22,(undefined1  [16])aVar4,auVar169);
      auVar22 = vblendps_avx(auVar111,auVar132,8);
      auVar9 = vsubps_avx(auVar11,auVar8);
      uVar109 = auVar9._0_4_;
      auVar192._4_4_ = uVar109;
      auVar192._0_4_ = uVar109;
      auVar192._8_4_ = uVar109;
      auVar192._12_4_ = uVar109;
      auVar7 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar207._0_4_ = fVar146 * auVar9._0_4_;
      auVar207._4_4_ = fVar145 * auVar9._4_4_;
      auVar207._8_4_ = fVar124 * auVar9._8_4_;
      auVar207._12_4_ = fVar125 * auVar9._12_4_;
      auVar7 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar5,auVar7);
      auVar147 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar4,auVar192);
      auVar7 = vblendps_avx(auVar147,auVar11,8);
      auVar9 = vsubps_avx(_local_660,auVar8);
      uVar109 = auVar9._0_4_;
      auVar193._4_4_ = uVar109;
      auVar193._0_4_ = uVar109;
      auVar193._8_4_ = uVar109;
      auVar193._12_4_ = uVar109;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar210._0_4_ = fVar146 * auVar9._0_4_;
      auVar210._4_4_ = fVar145 * auVar9._4_4_;
      auVar210._8_4_ = fVar124 * auVar9._8_4_;
      auVar210._12_4_ = fVar125 * auVar9._12_4_;
      auVar8 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar5,auVar8);
      auVar112 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar4,auVar193);
      auVar8 = vblendps_avx(auVar112,_local_660,8);
      auVar25._4_4_ = uStack_3ec;
      auVar25._0_4_ = local_3f0;
      auVar25._8_4_ = uStack_3e8;
      auVar25._12_4_ = uStack_3e4;
      auVar21 = vandps_avx(auVar21,auVar25);
      auVar22 = vandps_avx(auVar22,auVar25);
      auVar9 = vmaxps_avx(auVar21,auVar22);
      auVar21 = vandps_avx(auVar7,auVar25);
      auVar22 = vandps_avx(auVar8,auVar25);
      auVar21 = vmaxps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar9,auVar21);
      auVar22 = vmovshdup_avx(auVar21);
      auVar22 = vmaxss_avx(auVar22,auVar21);
      auVar21 = vshufpd_avx(auVar21,auVar21,1);
      auVar21 = vmaxss_avx(auVar21,auVar22);
      auVar22 = vmovshdup_avx(auVar13);
      local_600 = auVar22._0_8_;
      auVar7 = vmovshdup_avx(auVar111);
      uVar110 = auVar7._0_8_;
      auVar217._8_8_ = uVar110;
      auVar217._0_8_ = uVar110;
      auVar217._16_8_ = uVar110;
      auVar217._24_8_ = uVar110;
      auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x908);
      uVar109 = auVar147._0_4_;
      auVar186._4_4_ = uVar109;
      auVar186._0_4_ = uVar109;
      auVar186._8_4_ = uVar109;
      auVar186._12_4_ = uVar109;
      auVar186._16_4_ = uVar109;
      auVar186._20_4_ = uVar109;
      auVar186._24_4_ = uVar109;
      auVar186._28_4_ = uVar109;
      auVar8 = vmovshdup_avx(auVar147);
      uVar110 = auVar8._0_8_;
      auVar198._8_8_ = uVar110;
      auVar198._0_8_ = uVar110;
      auVar198._16_8_ = uVar110;
      auVar198._24_8_ = uVar110;
      fVar146 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar24 + 0xd8c);
      auVar95 = *(undefined1 (*) [28])(bezier_basis0 + lVar24 + 0xd8c);
      auVar8 = vmovshdup_avx(auVar112);
      uVar110 = auVar8._0_8_;
      fVar209 = auVar112._0_4_;
      auVar135._0_4_ = fVar209 * fVar146;
      auVar135._4_4_ = fVar209 * *(float *)(bezier_basis0 + lVar24 + 0xd90);
      auVar135._8_4_ = fVar209 * *(float *)(bezier_basis0 + lVar24 + 0xd94);
      auVar135._12_4_ = fVar209 * *(float *)(bezier_basis0 + lVar24 + 0xd98);
      auVar135._16_4_ = fVar209 * *(float *)(bezier_basis0 + lVar24 + 0xd9c);
      auVar135._20_4_ = fVar209 * *(float *)(bezier_basis0 + lVar24 + 0xda0);
      auVar135._24_4_ = fVar209 * *(float *)(bezier_basis0 + lVar24 + 0xda4);
      auVar135._28_4_ = 0;
      auVar9 = vfmadd231ps_fma(auVar135,auVar134,auVar186);
      fVar144 = auVar8._0_4_;
      auVar181._0_4_ = fVar144 * fVar146;
      fVar166 = auVar8._4_4_;
      auVar181._4_4_ = fVar166 * *(float *)(bezier_basis0 + lVar24 + 0xd90);
      auVar181._8_4_ = fVar144 * *(float *)(bezier_basis0 + lVar24 + 0xd94);
      auVar181._12_4_ = fVar166 * *(float *)(bezier_basis0 + lVar24 + 0xd98);
      auVar181._16_4_ = fVar144 * *(float *)(bezier_basis0 + lVar24 + 0xd9c);
      auVar181._20_4_ = fVar166 * *(float *)(bezier_basis0 + lVar24 + 0xda0);
      auVar181._24_4_ = fVar144 * *(float *)(bezier_basis0 + lVar24 + 0xda4);
      auVar181._28_4_ = 0;
      auVar8 = vfmadd231ps_fma(auVar181,auVar134,auVar198);
      auVar135 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x484);
      uVar109 = auVar111._0_4_;
      auVar230._4_4_ = uVar109;
      auVar230._0_4_ = uVar109;
      auVar230._8_4_ = uVar109;
      auVar230._12_4_ = uVar109;
      auVar230._16_4_ = uVar109;
      auVar230._20_4_ = uVar109;
      auVar230._24_4_ = uVar109;
      auVar230._28_4_ = uVar109;
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar135,auVar230);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar135,auVar217);
      auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar24);
      auVar221._0_4_ = auVar13._0_4_;
      auVar221._4_4_ = auVar221._0_4_;
      auVar221._8_4_ = auVar221._0_4_;
      auVar221._12_4_ = auVar221._0_4_;
      auVar221._16_4_ = auVar221._0_4_;
      auVar221._20_4_ = auVar221._0_4_;
      auVar221._24_4_ = auVar221._0_4_;
      auVar221._28_4_ = auVar221._0_4_;
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar120,auVar221);
      auVar90._8_8_ = local_600;
      auVar90._0_8_ = local_600;
      auVar90._16_8_ = local_600;
      auVar90._24_8_ = local_600;
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar120,auVar90);
      auVar140 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x908);
      pauVar2 = (undefined1 (*) [32])(bezier_basis1 + lVar24 + 0xd8c);
      fVar146 = *(float *)*pauVar2;
      fVar145 = *(float *)(bezier_basis1 + lVar24 + 0xd90);
      fVar124 = *(float *)(bezier_basis1 + lVar24 + 0xd94);
      fVar125 = *(float *)(bezier_basis1 + lVar24 + 0xd98);
      fVar126 = *(float *)(bezier_basis1 + lVar24 + 0xd9c);
      fVar127 = *(float *)(bezier_basis1 + lVar24 + 0xda0);
      fVar128 = *(float *)(bezier_basis1 + lVar24 + 0xda4);
      auVar96 = *(undefined1 (*) [28])*pauVar2;
      auVar26._4_4_ = fVar209 * fVar145;
      auVar26._0_4_ = fVar209 * fVar146;
      auVar26._8_4_ = fVar209 * fVar124;
      auVar26._12_4_ = fVar209 * fVar125;
      auVar26._16_4_ = fVar209 * fVar126;
      auVar26._20_4_ = fVar209 * fVar127;
      auVar26._24_4_ = fVar209 * fVar128;
      auVar26._28_4_ = fVar209;
      auVar10 = vfmadd231ps_fma(auVar26,auVar140,auVar186);
      auVar27._4_4_ = fVar166 * fVar145;
      auVar27._0_4_ = fVar144 * fVar146;
      auVar27._8_4_ = fVar144 * fVar124;
      auVar27._12_4_ = fVar166 * fVar125;
      auVar27._16_4_ = fVar144 * fVar126;
      auVar27._20_4_ = fVar166 * fVar127;
      auVar27._24_4_ = fVar144 * fVar128;
      auVar27._28_4_ = fVar166;
      auVar25 = vfmadd231ps_fma(auVar27,auVar140,auVar198);
      auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x484);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar123,auVar230);
      auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar123,auVar217);
      auVar23 = *(undefined1 (*) [32])(bezier_basis1 + lVar24);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar23,auVar221);
      auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar23,auVar90);
      local_440 = ZEXT1632(auVar10);
      local_420 = ZEXT1632(auVar9);
      local_4c0 = vsubps_avx(local_440,local_420);
      _local_460 = ZEXT1632(auVar25);
      local_480 = ZEXT1632(auVar8);
      local_5a0 = vsubps_avx(_local_460,local_480);
      auVar114._0_4_ = local_4c0._0_4_ * auVar8._0_4_;
      auVar114._4_4_ = local_4c0._4_4_ * auVar8._4_4_;
      auVar114._8_4_ = local_4c0._8_4_ * auVar8._8_4_;
      auVar114._12_4_ = local_4c0._12_4_ * auVar8._12_4_;
      auVar114._16_4_ = local_4c0._16_4_ * 0.0;
      auVar114._20_4_ = local_4c0._20_4_ * 0.0;
      auVar114._24_4_ = local_4c0._24_4_ * 0.0;
      auVar114._28_4_ = 0;
      fVar143 = local_5a0._0_4_;
      auVar136._0_4_ = fVar143 * auVar9._0_4_;
      fVar222 = local_5a0._4_4_;
      auVar136._4_4_ = fVar222 * auVar9._4_4_;
      fVar223 = local_5a0._8_4_;
      auVar136._8_4_ = fVar223 * auVar9._8_4_;
      fVar224 = local_5a0._12_4_;
      auVar136._12_4_ = fVar224 * auVar9._12_4_;
      fVar225 = local_5a0._16_4_;
      auVar136._16_4_ = fVar225 * 0.0;
      fVar226 = local_5a0._20_4_;
      auVar136._20_4_ = fVar226 * 0.0;
      fVar227 = local_5a0._24_4_;
      auVar136._24_4_ = fVar227 * 0.0;
      auVar136._28_4_ = 0;
      auVar20 = vsubps_avx(auVar114,auVar136);
      auVar8 = vpermilps_avx(auVar12,0xff);
      uVar131 = auVar8._0_8_;
      local_a0._8_8_ = uVar131;
      local_a0._0_8_ = uVar131;
      local_a0._16_8_ = uVar131;
      local_a0._24_8_ = uVar131;
      auVar9 = vpermilps_avx(auVar132,0xff);
      uVar131 = auVar9._0_8_;
      auVar182._8_8_ = uVar131;
      auVar182._0_8_ = uVar131;
      auVar182._16_8_ = uVar131;
      auVar182._24_8_ = uVar131;
      auVar10 = vpermilps_avx(auVar11,0xff);
      uVar131 = auVar10._0_8_;
      local_c0._8_8_ = uVar131;
      local_c0._0_8_ = uVar131;
      local_c0._16_8_ = uVar131;
      local_c0._24_8_ = uVar131;
      auVar10 = vpermilps_avx(_local_660,0xff);
      local_e0 = auVar10._0_8_;
      local_960._0_4_ = auVar95._0_4_;
      local_960._4_4_ = auVar95._4_4_;
      fStack_958 = auVar95._8_4_;
      fStack_954 = auVar95._12_4_;
      fStack_950 = auVar95._16_4_;
      fStack_94c = auVar95._20_4_;
      fStack_948 = auVar95._24_4_;
      fVar129 = auVar10._0_4_;
      fVar130 = auVar10._4_4_;
      auVar28._4_4_ = fVar130 * (float)local_960._4_4_;
      auVar28._0_4_ = fVar129 * (float)local_960._0_4_;
      auVar28._8_4_ = fVar129 * fStack_958;
      auVar28._12_4_ = fVar130 * fStack_954;
      auVar28._16_4_ = fVar129 * fStack_950;
      auVar28._20_4_ = fVar130 * fStack_94c;
      auVar28._24_4_ = fVar129 * fStack_948;
      auVar28._28_4_ = auVar22._4_4_;
      auVar22 = vfmadd231ps_fma(auVar28,local_c0,auVar134);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar135,auVar182);
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar120,local_a0);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar29._4_4_ = fVar130 * fVar145;
      auVar29._0_4_ = fVar129 * fVar146;
      auVar29._8_4_ = fVar129 * fVar124;
      auVar29._12_4_ = fVar130 * fVar125;
      auVar29._16_4_ = fVar129 * fVar126;
      auVar29._20_4_ = fVar130 * fVar127;
      auVar29._24_4_ = fVar129 * fVar128;
      auVar29._28_4_ = auVar135._28_4_;
      auVar22 = vfmadd231ps_fma(auVar29,auVar140,local_c0);
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar123,auVar182);
      auVar25 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar23,local_a0);
      auVar30._4_4_ = fVar222 * fVar222;
      auVar30._0_4_ = fVar143 * fVar143;
      auVar30._8_4_ = fVar223 * fVar223;
      auVar30._12_4_ = fVar224 * fVar224;
      auVar30._16_4_ = fVar225 * fVar225;
      auVar30._20_4_ = fVar226 * fVar226;
      auVar30._24_4_ = fVar227 * fVar227;
      auVar30._28_4_ = auVar8._4_4_;
      auVar22 = vfmadd231ps_fma(auVar30,local_4c0,local_4c0);
      auVar200 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar25));
      auVar31._4_4_ = auVar200._4_4_ * auVar200._4_4_ * auVar22._4_4_;
      auVar31._0_4_ = auVar200._0_4_ * auVar200._0_4_ * auVar22._0_4_;
      auVar31._8_4_ = auVar200._8_4_ * auVar200._8_4_ * auVar22._8_4_;
      auVar31._12_4_ = auVar200._12_4_ * auVar200._12_4_ * auVar22._12_4_;
      auVar31._16_4_ = auVar200._16_4_ * auVar200._16_4_ * 0.0;
      auVar31._20_4_ = auVar200._20_4_ * auVar200._20_4_ * 0.0;
      auVar31._24_4_ = auVar200._24_4_ * auVar200._24_4_ * 0.0;
      auVar31._28_4_ = auVar200._28_4_;
      auVar32._4_4_ = auVar20._4_4_ * auVar20._4_4_;
      auVar32._0_4_ = auVar20._0_4_ * auVar20._0_4_;
      auVar32._8_4_ = auVar20._8_4_ * auVar20._8_4_;
      auVar32._12_4_ = auVar20._12_4_ * auVar20._12_4_;
      auVar32._16_4_ = auVar20._16_4_ * auVar20._16_4_;
      auVar32._20_4_ = auVar20._20_4_ * auVar20._20_4_;
      auVar32._24_4_ = auVar20._24_4_ * auVar20._24_4_;
      auVar32._28_4_ = auVar20._28_4_;
      auVar200 = vcmpps_avx(auVar32,auVar31,2);
      fVar146 = auVar21._0_4_ * 4.7683716e-07;
      auVar115._0_4_ = (float)iVar101;
      uStack_5bc = auVar112._4_4_;
      uStack_5b8 = auVar112._8_4_;
      uStack_5b4 = auVar112._12_4_;
      auVar115._4_4_ = auVar115._0_4_;
      auVar115._8_4_ = auVar115._0_4_;
      auVar115._12_4_ = auVar115._0_4_;
      auVar115._16_4_ = auVar115._0_4_;
      auVar115._20_4_ = auVar115._0_4_;
      auVar115._24_4_ = auVar115._0_4_;
      auVar115._28_4_ = auVar115._0_4_;
      auVar20 = vcmpps_avx(_DAT_01faff40,auVar115,1);
      auVar22 = vpermilps_avx(auVar13,0xaa);
      uVar131 = auVar22._0_8_;
      local_620._8_8_ = uVar131;
      local_620._0_8_ = uVar131;
      local_620._16_8_ = uVar131;
      local_620._24_8_ = uVar131;
      auVar21 = vpermilps_avx(auVar111,0xaa);
      uVar131 = auVar21._0_8_;
      local_540._8_8_ = uVar131;
      local_540._0_8_ = uVar131;
      local_540._16_8_ = uVar131;
      local_540._24_8_ = uVar131;
      auVar8 = vpermilps_avx(auVar147,0xaa);
      uVar131 = auVar8._0_8_;
      local_100._8_8_ = uVar131;
      local_100._0_8_ = uVar131;
      local_100._16_8_ = uVar131;
      local_100._24_8_ = uVar131;
      auVar21 = vshufps_avx(auVar112,auVar112,0xaa);
      uStack_550 = auVar21._0_8_;
      auVar122 = auVar20 & auVar200;
      uVar105 = *(uint *)(ray + k * 4 + 0x60);
      local_580._0_16_ = ZEXT416(uVar105);
      uStack_558 = uStack_550;
      local_560 = uStack_550;
      local_770 = auVar12._0_8_;
      uStack_768 = auVar12._8_8_;
      local_780 = auVar132._0_8_;
      uStack_778 = auVar132._8_8_;
      local_790 = auVar11._0_8_;
      uStack_788 = auVar11._8_8_;
      auVar162 = local_6c0;
      uStack_5f8 = local_600;
      uStack_5f0 = local_600;
      uStack_5e8 = local_600;
      local_5c0 = auVar115._0_4_;
      uStack_548 = uStack_550;
      if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0x7f,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar122 >> 0xbf,0) == '\0') &&
          (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar122[0x1f]) {
LAB_018de141:
        auVar191 = ZEXT3264(CONCAT428(fVar166,CONCAT424(fVar144,CONCAT420(fVar166,CONCAT416(fVar144,
                                                  CONCAT412(fVar166,CONCAT48(fVar144,uVar110)))))));
        auVar194 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,CONCAT416(fVar209,
                                                  CONCAT412(fVar209,CONCAT48(fVar209,CONCAT44(
                                                  fVar209,fVar209))))))));
LAB_018de15c:
        bVar106 = false;
        auVar140 = local_6a0;
      }
      else {
        _local_4e0 = vandps_avx(auVar200,auVar20);
        local_4a0._0_4_ = auVar96._0_4_;
        local_4a0._4_4_ = auVar96._4_4_;
        fStack_498 = auVar96._8_4_;
        fStack_494 = auVar96._12_4_;
        fStack_490 = auVar96._16_4_;
        fStack_48c = auVar96._20_4_;
        fStack_488 = auVar96._24_4_;
        fVar130 = auVar21._0_4_;
        fVar143 = auVar21._4_4_;
        auVar33._4_4_ = fVar143 * (float)local_4a0._4_4_;
        auVar33._0_4_ = fVar130 * (float)local_4a0._0_4_;
        auVar33._8_4_ = fVar130 * fStack_498;
        auVar33._12_4_ = fVar143 * fStack_494;
        auVar33._16_4_ = fVar130 * fStack_490;
        auVar33._20_4_ = fVar143 * fStack_48c;
        auVar33._24_4_ = fVar130 * fStack_488;
        auVar33._28_4_ = local_4e0._28_4_;
        auVar21 = vfmadd213ps_fma(auVar140,local_100,auVar33);
        auVar21 = vfmadd213ps_fma(auVar123,local_540,ZEXT1632(auVar21));
        auVar21 = vfmadd213ps_fma(auVar23,local_620,ZEXT1632(auVar21));
        auVar116._0_4_ = fVar130 * (float)local_960._0_4_;
        auVar116._4_4_ = fVar143 * (float)local_960._4_4_;
        auVar116._8_4_ = fVar130 * fStack_958;
        auVar116._12_4_ = fVar143 * fStack_954;
        auVar116._16_4_ = fVar130 * fStack_950;
        auVar116._20_4_ = fVar143 * fStack_94c;
        auVar116._24_4_ = fVar130 * fStack_948;
        auVar116._28_4_ = 0;
        auVar13 = vfmadd213ps_fma(auVar134,local_100,auVar116);
        auVar13 = vfmadd213ps_fma(auVar135,local_540,ZEXT1632(auVar13));
        auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1210);
        auVar135 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1694);
        auVar140 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1b18);
        fVar145 = *(float *)(bezier_basis0 + lVar24 + 0x1f9c);
        fVar124 = *(float *)(bezier_basis0 + lVar24 + 0x1fa0);
        fVar125 = *(float *)(bezier_basis0 + lVar24 + 0x1fa4);
        fVar126 = *(float *)(bezier_basis0 + lVar24 + 0x1fa8);
        fVar127 = *(float *)(bezier_basis0 + lVar24 + 0x1fac);
        fVar128 = *(float *)(bezier_basis0 + lVar24 + 0x1fb0);
        fVar129 = *(float *)(bezier_basis0 + lVar24 + 0x1fb4);
        auVar34._4_4_ = fVar124 * fVar209;
        auVar34._0_4_ = fVar145 * fVar209;
        auVar34._8_4_ = fVar125 * fVar209;
        auVar34._12_4_ = fVar126 * fVar209;
        auVar34._16_4_ = fVar127 * fVar209;
        auVar34._20_4_ = fVar128 * fVar209;
        auVar34._24_4_ = fVar129 * fVar209;
        auVar34._28_4_ = auVar9._4_4_;
        auVar199._0_4_ = fVar144 * fVar145;
        auVar199._4_4_ = fVar166 * fVar124;
        auVar199._8_4_ = fVar144 * fVar125;
        auVar199._12_4_ = fVar166 * fVar126;
        auVar199._16_4_ = fVar144 * fVar127;
        auVar199._20_4_ = fVar166 * fVar128;
        auVar199._24_4_ = fVar144 * fVar129;
        auVar199._28_4_ = 0;
        auVar35._4_4_ = fVar143 * fVar124;
        auVar35._0_4_ = fVar130 * fVar145;
        auVar35._8_4_ = fVar130 * fVar125;
        auVar35._12_4_ = fVar143 * fVar126;
        auVar35._16_4_ = fVar130 * fVar127;
        auVar35._20_4_ = fVar143 * fVar128;
        auVar35._24_4_ = fVar130 * fVar129;
        auVar35._28_4_ = fVar143;
        auVar9 = vfmadd231ps_fma(auVar34,auVar140,auVar186);
        auVar111 = vfmadd231ps_fma(auVar199,auVar140,auVar198);
        auVar147 = vfmadd231ps_fma(auVar35,local_100,auVar140);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar135,auVar230);
        auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar135,auVar217);
        auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),local_540,auVar135);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar134,auVar221);
        auVar91._8_8_ = local_600;
        auVar91._0_8_ = local_600;
        auVar91._16_8_ = local_600;
        auVar91._24_8_ = local_600;
        auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar134,auVar91);
        auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),local_620,auVar134);
        fVar145 = *(float *)(bezier_basis1 + lVar24 + 0x1f9c);
        fVar124 = *(float *)(bezier_basis1 + lVar24 + 0x1fa0);
        fVar125 = *(float *)(bezier_basis1 + lVar24 + 0x1fa4);
        fVar126 = *(float *)(bezier_basis1 + lVar24 + 0x1fa8);
        fVar127 = *(float *)(bezier_basis1 + lVar24 + 0x1fac);
        fVar128 = *(float *)(bezier_basis1 + lVar24 + 0x1fb0);
        fVar129 = *(float *)(bezier_basis1 + lVar24 + 0x1fb4);
        auVar36._4_4_ = fVar209 * fVar124;
        auVar36._0_4_ = fVar209 * fVar145;
        auVar36._8_4_ = fVar209 * fVar125;
        auVar36._12_4_ = fVar209 * fVar126;
        auVar36._16_4_ = fVar209 * fVar127;
        auVar36._20_4_ = fVar209 * fVar128;
        auVar36._24_4_ = fVar209 * fVar129;
        auVar36._28_4_ = auVar8._4_4_;
        auVar37._4_4_ = fVar166 * fVar124;
        auVar37._0_4_ = fVar144 * fVar145;
        auVar37._8_4_ = fVar144 * fVar125;
        auVar37._12_4_ = fVar166 * fVar126;
        auVar37._16_4_ = fVar144 * fVar127;
        auVar37._20_4_ = fVar166 * fVar128;
        auVar37._24_4_ = fVar144 * fVar129;
        auVar37._28_4_ = fVar166;
        auVar38._4_4_ = fVar124 * fVar143;
        auVar38._0_4_ = fVar145 * fVar130;
        auVar38._8_4_ = fVar125 * fVar130;
        auVar38._12_4_ = fVar126 * fVar143;
        auVar38._16_4_ = fVar127 * fVar130;
        auVar38._20_4_ = fVar128 * fVar143;
        auVar38._24_4_ = fVar129 * fVar130;
        auVar38._28_4_ = auVar22._4_4_;
        auVar134 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1b18);
        auVar22 = vfmadd231ps_fma(auVar36,auVar134,auVar186);
        auVar8 = vfmadd231ps_fma(auVar37,auVar134,auVar198);
        auVar112 = vfmadd231ps_fma(auVar38,local_100,auVar134);
        auVar134 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1694);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar134,auVar230);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar134,auVar217);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar134,local_540);
        auVar134 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1210);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar134,auVar221);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar134,auVar91);
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),local_620,auVar134);
        auVar134 = vandps_avx(local_3c0,ZEXT1632(auVar9));
        auVar135 = vandps_avx(ZEXT1632(auVar111),local_3c0);
        auVar135 = vmaxps_avx(auVar134,auVar135);
        auVar134 = vandps_avx(ZEXT1632(auVar147),local_3c0);
        auVar134 = vmaxps_avx(auVar135,auVar134);
        auVar137._4_4_ = fVar146;
        auVar137._0_4_ = fVar146;
        auVar137._8_4_ = fVar146;
        auVar137._12_4_ = fVar146;
        auVar137._16_4_ = fVar146;
        auVar137._20_4_ = fVar146;
        auVar137._24_4_ = fVar146;
        auVar137._28_4_ = fVar146;
        auVar134 = vcmpps_avx(auVar134,auVar137,1);
        auVar140 = vblendvps_avx(ZEXT1632(auVar9),local_4c0,auVar134);
        auVar123 = vblendvps_avx(ZEXT1632(auVar111),local_5a0,auVar134);
        auVar134 = vandps_avx(local_3c0,ZEXT1632(auVar22));
        auVar135 = vandps_avx(ZEXT1632(auVar8),local_3c0);
        auVar135 = vmaxps_avx(auVar134,auVar135);
        auVar134 = vandps_avx(ZEXT1632(auVar112),local_3c0);
        auVar134 = vmaxps_avx(auVar135,auVar134);
        auVar135 = vcmpps_avx(auVar134,auVar137,1);
        auVar134 = vblendvps_avx(ZEXT1632(auVar22),local_4c0,auVar135);
        auVar135 = vblendvps_avx(ZEXT1632(auVar8),local_5a0,auVar135);
        auVar22 = vfmadd213ps_fma(auVar120,local_620,ZEXT1632(auVar13));
        auVar8 = vfmadd213ps_fma(auVar140,auVar140,ZEXT832(0) << 0x20);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar123,auVar123);
        auVar120 = vrsqrtps_avx(ZEXT1632(auVar8));
        fVar145 = auVar120._0_4_;
        fVar124 = auVar120._4_4_;
        fVar125 = auVar120._8_4_;
        fVar126 = auVar120._12_4_;
        fVar127 = auVar120._16_4_;
        fVar128 = auVar120._20_4_;
        fVar129 = auVar120._24_4_;
        auVar39._4_4_ = fVar124 * fVar124 * fVar124 * auVar8._4_4_ * -0.5;
        auVar39._0_4_ = fVar145 * fVar145 * fVar145 * auVar8._0_4_ * -0.5;
        auVar39._8_4_ = fVar125 * fVar125 * fVar125 * auVar8._8_4_ * -0.5;
        auVar39._12_4_ = fVar126 * fVar126 * fVar126 * auVar8._12_4_ * -0.5;
        auVar39._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar39._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar39._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar39._28_4_ = 0;
        auVar218._8_4_ = 0x3fc00000;
        auVar218._0_8_ = 0x3fc000003fc00000;
        auVar218._12_4_ = 0x3fc00000;
        auVar218._16_4_ = 0x3fc00000;
        auVar218._20_4_ = 0x3fc00000;
        auVar218._24_4_ = 0x3fc00000;
        auVar218._28_4_ = 0x3fc00000;
        auVar8 = vfmadd231ps_fma(auVar39,auVar218,auVar120);
        fVar145 = auVar8._0_4_;
        fVar124 = auVar8._4_4_;
        auVar40._4_4_ = auVar123._4_4_ * fVar124;
        auVar40._0_4_ = auVar123._0_4_ * fVar145;
        fVar125 = auVar8._8_4_;
        auVar40._8_4_ = auVar123._8_4_ * fVar125;
        fVar126 = auVar8._12_4_;
        auVar40._12_4_ = auVar123._12_4_ * fVar126;
        auVar40._16_4_ = auVar123._16_4_ * 0.0;
        auVar40._20_4_ = auVar123._20_4_ * 0.0;
        auVar40._24_4_ = auVar123._24_4_ * 0.0;
        auVar40._28_4_ = auVar120._28_4_;
        auVar41._4_4_ = -auVar140._4_4_ * fVar124;
        auVar41._0_4_ = -auVar140._0_4_ * fVar145;
        auVar41._8_4_ = -auVar140._8_4_ * fVar125;
        auVar41._12_4_ = -auVar140._12_4_ * fVar126;
        auVar41._16_4_ = -auVar140._16_4_ * 0.0;
        auVar41._20_4_ = -auVar140._20_4_ * 0.0;
        auVar41._24_4_ = -auVar140._24_4_ * 0.0;
        auVar41._28_4_ = 0;
        auVar8 = vfmadd213ps_fma(auVar134,auVar134,ZEXT832(0) << 0x20);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar135,auVar135);
        auVar120 = vrsqrtps_avx(ZEXT1632(auVar8));
        auVar140 = ZEXT1632(CONCAT412(fVar126 * 0.0,
                                      CONCAT48(fVar125 * 0.0,CONCAT44(fVar124 * 0.0,fVar145 * 0.0)))
                           );
        fVar145 = auVar120._0_4_;
        fVar124 = auVar120._4_4_;
        fVar125 = auVar120._8_4_;
        fVar126 = auVar120._12_4_;
        fVar127 = auVar120._16_4_;
        fVar128 = auVar120._20_4_;
        fVar129 = auVar120._24_4_;
        auVar42._4_4_ = fVar124 * fVar124 * fVar124 * auVar8._4_4_ * -0.5;
        auVar42._0_4_ = fVar145 * fVar145 * fVar145 * auVar8._0_4_ * -0.5;
        auVar42._8_4_ = fVar125 * fVar125 * fVar125 * auVar8._8_4_ * -0.5;
        auVar42._12_4_ = fVar126 * fVar126 * fVar126 * auVar8._12_4_ * -0.5;
        auVar42._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar42._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar42._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar42._28_4_ = 0xbf000000;
        auVar8 = vfmadd231ps_fma(auVar42,auVar218,auVar120);
        fVar145 = auVar8._0_4_;
        fVar124 = auVar8._4_4_;
        auVar43._4_4_ = fVar124 * auVar135._4_4_;
        auVar43._0_4_ = fVar145 * auVar135._0_4_;
        fVar125 = auVar8._8_4_;
        auVar43._8_4_ = fVar125 * auVar135._8_4_;
        fVar126 = auVar8._12_4_;
        auVar43._12_4_ = fVar126 * auVar135._12_4_;
        auVar43._16_4_ = auVar135._16_4_ * 0.0;
        auVar43._20_4_ = auVar135._20_4_ * 0.0;
        auVar43._24_4_ = auVar135._24_4_ * 0.0;
        auVar43._28_4_ = 0;
        auVar44._4_4_ = fVar124 * -auVar134._4_4_;
        auVar44._0_4_ = fVar145 * -auVar134._0_4_;
        auVar44._8_4_ = fVar125 * -auVar134._8_4_;
        auVar44._12_4_ = fVar126 * -auVar134._12_4_;
        auVar44._16_4_ = -auVar134._16_4_ * 0.0;
        auVar44._20_4_ = -auVar134._20_4_ * 0.0;
        auVar44._24_4_ = -auVar134._24_4_ * 0.0;
        auVar44._28_4_ = 0x3fc00000;
        auVar45._28_4_ = auVar120._28_4_;
        auVar45._0_28_ =
             ZEXT1628(CONCAT412(fVar126 * 0.0,
                                CONCAT48(fVar125 * 0.0,CONCAT44(fVar124 * 0.0,fVar145 * 0.0))));
        auVar8 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar10),local_420);
        auVar134 = ZEXT1632(auVar10);
        auVar9 = vfmadd213ps_fma(auVar41,auVar134,local_480);
        auVar13 = vfmadd213ps_fma(auVar140,auVar134,ZEXT1632(auVar22));
        auVar112 = vfnmadd213ps_fma(auVar40,auVar134,local_420);
        auVar111 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar25),local_440);
        auVar133 = vfnmadd213ps_fma(auVar41,auVar134,local_480);
        auVar134 = ZEXT1632(auVar25);
        auVar147 = vfmadd213ps_fma(auVar44,auVar134,_local_460);
        auVar171 = ZEXT1632(auVar10);
        auVar167 = vfnmadd231ps_fma(ZEXT1632(auVar22),auVar171,auVar140);
        auVar22 = vfmadd213ps_fma(auVar45,auVar134,ZEXT1632(auVar21));
        auVar148 = vfnmadd213ps_fma(auVar43,auVar134,local_440);
        auVar149 = vfnmadd213ps_fma(auVar44,auVar134,_local_460);
        auVar168 = vfnmadd231ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar25),auVar45);
        auVar134 = vsubps_avx(ZEXT1632(auVar147),ZEXT1632(auVar133));
        auVar135 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar167));
        auVar158._0_4_ = auVar134._0_4_ * auVar167._0_4_;
        auVar158._4_4_ = auVar134._4_4_ * auVar167._4_4_;
        auVar158._8_4_ = auVar134._8_4_ * auVar167._8_4_;
        auVar158._12_4_ = auVar134._12_4_ * auVar167._12_4_;
        auVar158._16_4_ = auVar134._16_4_ * 0.0;
        auVar158._20_4_ = auVar134._20_4_ * 0.0;
        auVar158._24_4_ = auVar134._24_4_ * 0.0;
        auVar158._28_4_ = 0;
        auVar10 = vfmsub231ps_fma(auVar158,ZEXT1632(auVar133),auVar135);
        auVar46._4_4_ = auVar112._4_4_ * auVar135._4_4_;
        auVar46._0_4_ = auVar112._0_4_ * auVar135._0_4_;
        auVar46._8_4_ = auVar112._8_4_ * auVar135._8_4_;
        auVar46._12_4_ = auVar112._12_4_ * auVar135._12_4_;
        auVar46._16_4_ = auVar135._16_4_ * 0.0;
        auVar46._20_4_ = auVar135._20_4_ * 0.0;
        auVar46._24_4_ = auVar135._24_4_ * 0.0;
        auVar46._28_4_ = auVar135._28_4_;
        auVar200 = ZEXT1632(auVar112);
        auVar135 = vsubps_avx(ZEXT1632(auVar111),auVar200);
        auVar122 = ZEXT1632(auVar167);
        auVar21 = vfmsub231ps_fma(auVar46,auVar122,auVar135);
        auVar47._4_4_ = auVar133._4_4_ * auVar135._4_4_;
        auVar47._0_4_ = auVar133._0_4_ * auVar135._0_4_;
        auVar47._8_4_ = auVar133._8_4_ * auVar135._8_4_;
        auVar47._12_4_ = auVar133._12_4_ * auVar135._12_4_;
        auVar47._16_4_ = auVar135._16_4_ * 0.0;
        auVar47._20_4_ = auVar135._20_4_ * 0.0;
        auVar47._24_4_ = auVar135._24_4_ * 0.0;
        auVar47._28_4_ = auVar135._28_4_;
        auVar112 = vfmsub231ps_fma(auVar47,auVar200,auVar134);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar112),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
        auVar162 = vcmpps_avx(ZEXT1632(auVar21),ZEXT832(0) << 0x20,2);
        auVar134 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar8),auVar162);
        auVar135 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar9),auVar162);
        auVar120 = vblendvps_avx(ZEXT1632(auVar168),ZEXT1632(auVar13),auVar162);
        auVar140 = vblendvps_avx(auVar200,ZEXT1632(auVar111),auVar162);
        auVar123 = vblendvps_avx(ZEXT1632(auVar133),ZEXT1632(auVar147),auVar162);
        auVar23 = vblendvps_avx(auVar122,ZEXT1632(auVar22),auVar162);
        auVar200 = vblendvps_avx(ZEXT1632(auVar111),auVar200,auVar162);
        auVar20 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar133),auVar162);
        auVar21 = vpackssdw_avx(local_4e0._0_16_,local_4e0._16_16_);
        auVar122 = vblendvps_avx(ZEXT1632(auVar22),auVar122,auVar162);
        auVar187 = vsubps_avx(auVar200,auVar134);
        auVar20 = vsubps_avx(auVar20,auVar135);
        auVar203 = vsubps_avx(auVar122,auVar120);
        auVar156 = vsubps_avx(auVar134,auVar140);
        auVar157 = vsubps_avx(auVar135,auVar123);
        auVar170 = vsubps_avx(auVar120,auVar23);
        auVar48._4_4_ = auVar203._4_4_ * auVar134._4_4_;
        auVar48._0_4_ = auVar203._0_4_ * auVar134._0_4_;
        auVar48._8_4_ = auVar203._8_4_ * auVar134._8_4_;
        auVar48._12_4_ = auVar203._12_4_ * auVar134._12_4_;
        auVar48._16_4_ = auVar203._16_4_ * auVar134._16_4_;
        auVar48._20_4_ = auVar203._20_4_ * auVar134._20_4_;
        auVar48._24_4_ = auVar203._24_4_ * auVar134._24_4_;
        auVar48._28_4_ = auVar122._28_4_;
        auVar22 = vfmsub231ps_fma(auVar48,auVar120,auVar187);
        auVar49._4_4_ = auVar187._4_4_ * auVar135._4_4_;
        auVar49._0_4_ = auVar187._0_4_ * auVar135._0_4_;
        auVar49._8_4_ = auVar187._8_4_ * auVar135._8_4_;
        auVar49._12_4_ = auVar187._12_4_ * auVar135._12_4_;
        auVar49._16_4_ = auVar187._16_4_ * auVar135._16_4_;
        auVar49._20_4_ = auVar187._20_4_ * auVar135._20_4_;
        auVar49._24_4_ = auVar187._24_4_ * auVar135._24_4_;
        auVar49._28_4_ = auVar200._28_4_;
        auVar8 = vfmsub231ps_fma(auVar49,auVar134,auVar20);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
        auVar117._0_4_ = auVar20._0_4_ * auVar120._0_4_;
        auVar117._4_4_ = auVar20._4_4_ * auVar120._4_4_;
        auVar117._8_4_ = auVar20._8_4_ * auVar120._8_4_;
        auVar117._12_4_ = auVar20._12_4_ * auVar120._12_4_;
        auVar117._16_4_ = auVar20._16_4_ * auVar120._16_4_;
        auVar117._20_4_ = auVar20._20_4_ * auVar120._20_4_;
        auVar117._24_4_ = auVar20._24_4_ * auVar120._24_4_;
        auVar117._28_4_ = 0;
        auVar8 = vfmsub231ps_fma(auVar117,auVar135,auVar203);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
        auVar118._0_4_ = auVar170._0_4_ * auVar140._0_4_;
        auVar118._4_4_ = auVar170._4_4_ * auVar140._4_4_;
        auVar118._8_4_ = auVar170._8_4_ * auVar140._8_4_;
        auVar118._12_4_ = auVar170._12_4_ * auVar140._12_4_;
        auVar118._16_4_ = auVar170._16_4_ * auVar140._16_4_;
        auVar118._20_4_ = auVar170._20_4_ * auVar140._20_4_;
        auVar118._24_4_ = auVar170._24_4_ * auVar140._24_4_;
        auVar118._28_4_ = 0;
        auVar22 = vfmsub231ps_fma(auVar118,auVar156,auVar23);
        auVar50._4_4_ = auVar157._4_4_ * auVar23._4_4_;
        auVar50._0_4_ = auVar157._0_4_ * auVar23._0_4_;
        auVar50._8_4_ = auVar157._8_4_ * auVar23._8_4_;
        auVar50._12_4_ = auVar157._12_4_ * auVar23._12_4_;
        auVar50._16_4_ = auVar157._16_4_ * auVar23._16_4_;
        auVar50._20_4_ = auVar157._20_4_ * auVar23._20_4_;
        auVar50._24_4_ = auVar157._24_4_ * auVar23._24_4_;
        auVar50._28_4_ = auVar23._28_4_;
        auVar9 = vfmsub231ps_fma(auVar50,auVar123,auVar170);
        auVar51._4_4_ = auVar156._4_4_ * auVar123._4_4_;
        auVar51._0_4_ = auVar156._0_4_ * auVar123._0_4_;
        auVar51._8_4_ = auVar156._8_4_ * auVar123._8_4_;
        auVar51._12_4_ = auVar156._12_4_ * auVar123._12_4_;
        auVar51._16_4_ = auVar156._16_4_ * auVar123._16_4_;
        auVar51._20_4_ = auVar156._20_4_ * auVar123._20_4_;
        auVar51._24_4_ = auVar156._24_4_ * auVar123._24_4_;
        auVar51._28_4_ = auVar123._28_4_;
        auVar10 = vfmsub231ps_fma(auVar51,auVar157,auVar140);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
        auVar140 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
        auVar140 = vcmpps_avx(auVar140,ZEXT832(0) << 0x20,2);
        auVar22 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
        auVar21 = vpand_avx(auVar21,auVar22);
        auVar140 = vpmovsxwd_avx2(auVar21);
        if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar140 >> 0x7f,0) == '\0') &&
              (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar140 >> 0xbf,0) == '\0') &&
            (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar140[0x1f]) {
          auVar165 = ZEXT864(0) << 0x20;
LAB_018df5ab:
          auVar191 = ZEXT3264(CONCAT824(uStack_628,
                                        CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
          auVar214 = ZEXT3264(local_6a0);
          auVar206 = ZEXT3264(local_6c0);
        }
        else {
          auVar52._4_4_ = auVar20._4_4_ * auVar170._4_4_;
          auVar52._0_4_ = auVar20._0_4_ * auVar170._0_4_;
          auVar52._8_4_ = auVar20._8_4_ * auVar170._8_4_;
          auVar52._12_4_ = auVar20._12_4_ * auVar170._12_4_;
          auVar52._16_4_ = auVar20._16_4_ * auVar170._16_4_;
          auVar52._20_4_ = auVar20._20_4_ * auVar170._20_4_;
          auVar52._24_4_ = auVar20._24_4_ * auVar170._24_4_;
          auVar52._28_4_ = auVar140._28_4_;
          auVar111 = vfmsub231ps_fma(auVar52,auVar157,auVar203);
          auVar138._0_4_ = auVar156._0_4_ * auVar203._0_4_;
          auVar138._4_4_ = auVar156._4_4_ * auVar203._4_4_;
          auVar138._8_4_ = auVar156._8_4_ * auVar203._8_4_;
          auVar138._12_4_ = auVar156._12_4_ * auVar203._12_4_;
          auVar138._16_4_ = auVar156._16_4_ * auVar203._16_4_;
          auVar138._20_4_ = auVar156._20_4_ * auVar203._20_4_;
          auVar138._24_4_ = auVar156._24_4_ * auVar203._24_4_;
          auVar138._28_4_ = 0;
          auVar13 = vfmsub231ps_fma(auVar138,auVar187,auVar170);
          auVar53._4_4_ = auVar187._4_4_ * auVar157._4_4_;
          auVar53._0_4_ = auVar187._0_4_ * auVar157._0_4_;
          auVar53._8_4_ = auVar187._8_4_ * auVar157._8_4_;
          auVar53._12_4_ = auVar187._12_4_ * auVar157._12_4_;
          auVar53._16_4_ = auVar187._16_4_ * auVar157._16_4_;
          auVar53._20_4_ = auVar187._20_4_ * auVar157._20_4_;
          auVar53._24_4_ = auVar187._24_4_ * auVar157._24_4_;
          auVar53._28_4_ = auVar187._28_4_;
          auVar147 = vfmsub231ps_fma(auVar53,auVar156,auVar20);
          auVar22 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar13),ZEXT1632(auVar147));
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar111),_DAT_01faff00);
          auVar140 = vrcpps_avx(ZEXT1632(auVar10));
          auVar208._8_4_ = 0x3f800000;
          auVar208._0_8_ = 0x3f8000003f800000;
          auVar208._12_4_ = 0x3f800000;
          auVar208._16_4_ = 0x3f800000;
          auVar208._20_4_ = 0x3f800000;
          auVar208._24_4_ = 0x3f800000;
          auVar208._28_4_ = 0x3f800000;
          auVar22 = vfnmadd213ps_fma(auVar140,ZEXT1632(auVar10),auVar208);
          auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar140,auVar140);
          auVar54._4_4_ = auVar147._4_4_ * auVar120._4_4_;
          auVar54._0_4_ = auVar147._0_4_ * auVar120._0_4_;
          auVar54._8_4_ = auVar147._8_4_ * auVar120._8_4_;
          auVar54._12_4_ = auVar147._12_4_ * auVar120._12_4_;
          auVar54._16_4_ = auVar120._16_4_ * 0.0;
          auVar54._20_4_ = auVar120._20_4_ * 0.0;
          auVar54._24_4_ = auVar120._24_4_ * 0.0;
          auVar54._28_4_ = auVar120._28_4_;
          auVar13 = vfmadd231ps_fma(auVar54,auVar135,ZEXT1632(auVar13));
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar111),auVar134);
          fVar145 = auVar22._0_4_;
          fVar124 = auVar22._4_4_;
          fVar125 = auVar22._8_4_;
          fVar126 = auVar22._12_4_;
          auVar55._28_4_ = auVar135._28_4_;
          auVar55._0_28_ =
               ZEXT1628(CONCAT412(fVar126 * auVar13._12_4_,
                                  CONCAT48(fVar125 * auVar13._8_4_,
                                           CONCAT44(fVar124 * auVar13._4_4_,fVar145 * auVar13._0_4_)
                                          )));
          auVar119._4_4_ = uVar105;
          auVar119._0_4_ = uVar105;
          auVar119._8_4_ = uVar105;
          auVar119._12_4_ = uVar105;
          auVar119._16_4_ = uVar105;
          auVar119._20_4_ = uVar105;
          auVar119._24_4_ = uVar105;
          auVar119._28_4_ = uVar105;
          uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar139._4_4_ = uVar109;
          auVar139._0_4_ = uVar109;
          auVar139._8_4_ = uVar109;
          auVar139._12_4_ = uVar109;
          auVar139._16_4_ = uVar109;
          auVar139._20_4_ = uVar109;
          auVar139._24_4_ = uVar109;
          auVar139._28_4_ = uVar109;
          auVar134 = vcmpps_avx(auVar119,auVar55,2);
          auVar135 = vcmpps_avx(auVar55,auVar139,2);
          auVar134 = vandps_avx(auVar135,auVar134);
          auVar22 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
          auVar21 = vpand_avx(auVar21,auVar22);
          auVar134 = vpmovsxwd_avx2(auVar21);
          auVar165 = ZEXT864(0) << 0x20;
          if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar134 >> 0x7f,0) == '\0') &&
                (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar134 >> 0xbf,0) == '\0') &&
              (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar134[0x1f]) goto LAB_018df5ab;
          auVar134 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar10),4);
          auVar22 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
          auVar21 = vpand_avx(auVar21,auVar22);
          auVar134 = vpmovsxwd_avx2(auVar21);
          auVar191 = ZEXT3264(CONCAT824(uStack_628,
                                        CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
          auVar214 = ZEXT3264(local_6a0);
          auVar206 = ZEXT3264(local_6c0);
          if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar134 >> 0x7f,0) != '\0') ||
                (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar134 >> 0xbf,0) != '\0') ||
              (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar134[0x1f] < '\0') {
            auVar120 = ZEXT1632(CONCAT412(fVar126 * auVar8._12_4_,
                                          CONCAT48(fVar125 * auVar8._8_4_,
                                                   CONCAT44(fVar124 * auVar8._4_4_,
                                                            fVar145 * auVar8._0_4_))));
            auVar140 = ZEXT1632(CONCAT412(fVar126 * auVar9._12_4_,
                                          CONCAT48(fVar125 * auVar9._8_4_,
                                                   CONCAT44(fVar124 * auVar9._4_4_,
                                                            fVar145 * auVar9._0_4_))));
            auVar177._8_4_ = 0x3f800000;
            auVar177._0_8_ = 0x3f8000003f800000;
            auVar177._12_4_ = 0x3f800000;
            auVar177._16_4_ = 0x3f800000;
            auVar177._20_4_ = 0x3f800000;
            auVar177._24_4_ = 0x3f800000;
            auVar177._28_4_ = 0x3f800000;
            auVar135 = vsubps_avx(auVar177,auVar120);
            auVar135 = vblendvps_avx(auVar135,auVar120,auVar162);
            auVar214 = ZEXT3264(auVar135);
            auVar135 = vsubps_avx(auVar177,auVar140);
            local_500 = vblendvps_avx(auVar135,auVar140,auVar162);
            auVar191 = ZEXT3264(auVar134);
            auVar206 = ZEXT3264(auVar55);
          }
        }
        auVar219 = ZEXT3264(auVar182);
        local_6a0 = auVar214._0_32_;
        auVar162 = auVar206._0_32_;
        auVar134 = auVar191._0_32_;
        if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar134 >> 0x7f,0) == '\0') &&
              (auVar191 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar134 >> 0xbf,0) == '\0') &&
            (auVar191 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar191[0x1f]) goto LAB_018de141;
        auVar135 = vsubps_avx(ZEXT1632(auVar25),auVar171);
        auVar21 = vfmadd213ps_fma(auVar135,local_6a0,auVar171);
        fVar145 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar56._4_4_ = (auVar21._4_4_ + auVar21._4_4_) * fVar145;
        auVar56._0_4_ = (auVar21._0_4_ + auVar21._0_4_) * fVar145;
        auVar56._8_4_ = (auVar21._8_4_ + auVar21._8_4_) * fVar145;
        auVar56._12_4_ = (auVar21._12_4_ + auVar21._12_4_) * fVar145;
        auVar56._16_4_ = fVar145 * 0.0;
        auVar56._20_4_ = fVar145 * 0.0;
        auVar56._24_4_ = fVar145 * 0.0;
        auVar56._28_4_ = 0;
        auVar135 = vcmpps_avx(auVar162,auVar56,6);
        auVar120 = auVar134 & auVar135;
        auVar191 = ZEXT3264(CONCAT428(fVar166,CONCAT424(fVar144,CONCAT420(fVar166,CONCAT416(fVar144,
                                                  CONCAT412(fVar166,CONCAT48(fVar144,uVar110)))))));
        auVar194 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,CONCAT416(fVar209,
                                                  CONCAT412(fVar209,CONCAT48(fVar209,CONCAT44(
                                                  fVar209,fVar209))))))));
        auVar140 = local_6a0;
        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar120 >> 0x7f,0) != '\0') ||
              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar120 >> 0xbf,0) != '\0') ||
            (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar120[0x1f] < '\0') {
          auVar141._8_4_ = 0xbf800000;
          auVar141._0_8_ = 0xbf800000bf800000;
          auVar141._12_4_ = 0xbf800000;
          auVar141._16_4_ = 0xbf800000;
          auVar141._20_4_ = 0xbf800000;
          auVar141._24_4_ = 0xbf800000;
          auVar141._28_4_ = 0xbf800000;
          auVar159._8_4_ = 0x40000000;
          auVar159._0_8_ = 0x4000000040000000;
          auVar159._12_4_ = 0x40000000;
          auVar159._16_4_ = 0x40000000;
          auVar159._20_4_ = 0x40000000;
          auVar159._24_4_ = 0x40000000;
          auVar159._28_4_ = 0x40000000;
          auVar21 = vfmadd213ps_fma(local_500,auVar159,auVar141);
          local_380 = ZEXT1632(auVar21);
          local_340 = 0;
          local_330 = local_770;
          uStack_328 = uStack_768;
          local_320 = local_780;
          uStack_318 = uStack_778;
          local_310 = local_790;
          uStack_308 = uStack_788;
          local_500 = local_380;
          if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar106 = true, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar134 = vandps_avx(auVar135,auVar134);
              fVar145 = 1.0 / auVar115._0_4_;
              local_2c0[0] = fVar145 * (auVar214._0_4_ + 0.0);
              local_2c0[1] = fVar145 * (auVar214._4_4_ + 1.0);
              local_2c0[2] = fVar145 * (auVar214._8_4_ + 2.0);
              local_2c0[3] = fVar145 * (auVar214._12_4_ + 3.0);
              fStack_2b0 = fVar145 * (auVar214._16_4_ + 4.0);
              fStack_2ac = fVar145 * (auVar214._20_4_ + 5.0);
              fStack_2a8 = fVar145 * (auVar214._24_4_ + 6.0);
              fStack_2a4 = auVar214._28_4_ + 7.0;
              local_500._0_8_ = auVar21._0_8_;
              local_500._8_8_ = auVar21._8_8_;
              local_2a0 = local_500._0_8_;
              uStack_298 = local_500._8_8_;
              uStack_290 = 0;
              uStack_288 = 0;
              local_280 = auVar162;
              uVar105 = vmovmskps_avx(auVar134);
              if (uVar105 == 0) goto LAB_018de24a;
              uVar102 = 0;
              uVar107 = (ulong)(uVar105 & 0xff);
              for (uVar104 = uVar107; (uVar104 & 1) == 0;
                  uVar104 = uVar104 >> 1 | 0x8000000000000000) {
                uVar102 = uVar102 + 1;
              }
              local_860._0_4_ = local_860._4_4_;
              local_860._8_4_ = local_860._4_4_;
              local_860._12_4_ = local_860._4_4_;
              local_860._16_4_ = local_860._4_4_;
              local_860._20_4_ = local_860._4_4_;
              local_860._24_4_ = local_860._4_4_;
              local_860._28_4_ = local_860._4_4_;
              local_880 = CONCAT44((uint)uStack_878,(uint)uStack_878);
              uStack_878._4_4_ = (uint)uStack_878;
              uStack_870._0_4_ = (uint)uStack_878;
              uStack_870._4_4_ = (uint)uStack_878;
              auVar98 = _local_880;
              uStack_868._0_4_ = (uint)uStack_878;
              uStack_868._4_4_ = (uint)uStack_878;
              auVar134 = _local_880;
              local_6e0 = ZEXT1632(CONCAT124(auVar25._4_12_,*(undefined4 *)(ray + k * 4 + 0x100)));
              local_700 = auVar182;
              local_6c0 = auVar162;
              _local_4a0 = *pauVar2;
              local_3a0 = local_6a0;
              local_360 = auVar162;
              local_33c = iVar101;
              do {
                local_200 = local_2c0[uVar102];
                local_1e0 = *(undefined4 *)((long)&local_2a0 + uVar102 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_280 + uVar102 * 4);
                fVar125 = 1.0 - local_200;
                auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar125 * fVar125)),
                                          ZEXT416((uint)(local_200 * fVar125)),ZEXT416(0xc0000000));
                auVar21 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar125)),
                                          ZEXT416((uint)(local_200 * local_200)),ZEXT416(0x40000000)
                                         );
                fVar145 = auVar21._0_4_ * 3.0;
                fVar124 = local_200 * local_200 * 3.0;
                auVar179._0_4_ = fVar124 * (float)local_660._0_4_;
                auVar179._4_4_ = fVar124 * (float)local_660._4_4_;
                auVar179._8_4_ = fVar124 * fStack_658;
                auVar179._12_4_ = fVar124 * fStack_654;
                auVar150._4_4_ = fVar145;
                auVar150._0_4_ = fVar145;
                auVar150._8_4_ = fVar145;
                auVar150._12_4_ = fVar145;
                auVar21 = vfmadd132ps_fma(auVar150,auVar179,auVar11);
                fVar145 = auVar22._0_4_ * 3.0;
                auVar175._4_4_ = fVar145;
                auVar175._0_4_ = fVar145;
                auVar175._8_4_ = fVar145;
                auVar175._12_4_ = fVar145;
                auVar21 = vfmadd132ps_fma(auVar175,auVar21,auVar132);
                fVar145 = fVar125 * fVar125 * -3.0;
                local_750.context = context->user;
                auVar151._4_4_ = fVar145;
                auVar151._0_4_ = fVar145;
                auVar151._8_4_ = fVar145;
                auVar151._12_4_ = fVar145;
                auVar22 = vfmadd132ps_fma(auVar151,auVar21,auVar12);
                local_260 = auVar22._0_4_;
                uStack_25c = local_260;
                uStack_258 = local_260;
                uStack_254 = local_260;
                uStack_250 = local_260;
                uStack_24c = local_260;
                uStack_248 = local_260;
                uStack_244 = local_260;
                auVar21 = vmovshdup_avx(auVar22);
                local_240 = auVar21._0_8_;
                uStack_238 = local_240;
                uStack_230 = local_240;
                uStack_228 = local_240;
                auVar21 = vshufps_avx(auVar22,auVar22,0xaa);
                auVar152._0_8_ = auVar21._0_8_;
                auVar152._8_8_ = auVar152._0_8_;
                auVar160._16_8_ = auVar152._0_8_;
                auVar160._0_16_ = auVar152;
                auVar160._24_8_ = auVar152._0_8_;
                local_220 = auVar160;
                fStack_1fc = local_200;
                fStack_1f8 = local_200;
                fStack_1f4 = local_200;
                fStack_1f0 = local_200;
                fStack_1ec = local_200;
                fStack_1e8 = local_200;
                fStack_1e4 = local_200;
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                uStack_870 = auVar98._16_8_;
                uStack_868 = auVar134._24_8_;
                local_1c0 = local_880;
                uStack_1b8 = uStack_878;
                uStack_1b0 = uStack_870;
                uStack_1a8 = uStack_868;
                local_1a0 = local_860;
                vpcmpeqd_avx2(local_860,local_860);
                local_180 = (local_750.context)->instID[0];
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160 = (local_750.context)->instPrimID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_680 = local_3e0;
                local_750.valid = (int *)local_680;
                local_750.geometryUserPtr = pGVar15->userPtr;
                local_750.hit = (RTCHitN *)&local_260;
                local_750.N = 8;
                local_750.ray = (RTCRayN *)ray;
                if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar160 = ZEXT1632(auVar152);
                  (*pGVar15->occlusionFilterN)(&local_750);
                  auVar219 = ZEXT3264(local_700);
                  auVar194 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,
                                                  CONCAT416(fVar209,CONCAT412(fVar209,CONCAT48(
                                                  fVar209,CONCAT44(fVar209,fVar209))))))));
                  auVar206 = ZEXT3264(local_6c0);
                  auVar214 = ZEXT3264(local_6a0);
                  auVar165 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar120 = vpcmpeqd_avx2(auVar165._0_32_,local_680);
                auVar140 = vpcmpeqd_avx2(auVar160,auVar160);
                auVar135 = auVar140 & ~auVar120;
                if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar135 >> 0x7f,0) == '\0') &&
                      (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar135 >> 0xbf,0) == '\0') &&
                    (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar135[0x1f]) {
                  auVar120 = auVar120 ^ auVar140;
                }
                else {
                  p_Var19 = context->args->filter;
                  if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar15->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var19)(&local_750);
                    auVar219 = ZEXT3264(local_700);
                    auVar194 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,
                                                  CONCAT416(fVar209,CONCAT412(fVar209,CONCAT48(
                                                  fVar209,CONCAT44(fVar209,fVar209))))))));
                    auVar206 = ZEXT3264(local_6c0);
                    auVar214 = ZEXT3264(local_6a0);
                    auVar165 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar135 = vpcmpeqd_avx2(auVar165._0_32_,local_680);
                  auVar120 = vpcmpeqd_avx2(local_680,local_680);
                  auVar120 = auVar135 ^ auVar120;
                  auVar161._8_4_ = 0xff800000;
                  auVar161._0_8_ = 0xff800000ff800000;
                  auVar161._12_4_ = 0xff800000;
                  auVar161._16_4_ = 0xff800000;
                  auVar161._20_4_ = 0xff800000;
                  auVar161._24_4_ = 0xff800000;
                  auVar161._28_4_ = 0xff800000;
                  auVar135 = vblendvps_avx(auVar161,*(undefined1 (*) [32])(local_750.ray + 0x100),
                                           auVar135);
                  *(undefined1 (*) [32])(local_750.ray + 0x100) = auVar135;
                }
                auVar162 = auVar206._0_32_;
                auVar182 = auVar219._0_32_;
                auVar191 = ZEXT3264(CONCAT428(fVar166,CONCAT424(fVar144,CONCAT420(fVar166,CONCAT416(
                                                  fVar144,CONCAT412(fVar166,CONCAT48(fVar144,uVar110
                                                                                    )))))));
                auVar140 = auVar214._0_32_;
                if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar120 >> 0x7f,0) != '\0') ||
                      (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar120 >> 0xbf,0) != '\0') ||
                    (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar120[0x1f] < '\0') {
                  bVar106 = true;
                  break;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = local_6e0._0_4_;
                uVar104 = uVar102 & 0x3f;
                bVar106 = false;
                uVar102 = 0;
                uVar107 = uVar107 ^ 1L << uVar104;
                for (uVar104 = uVar107; (uVar104 & 1) == 0;
                    uVar104 = uVar104 >> 1 | 0x8000000000000000) {
                  uVar102 = uVar102 + 1;
                }
              } while (uVar107 != 0);
            }
            goto LAB_018de165;
          }
          goto LAB_018de15c;
        }
LAB_018de24a:
        bVar106 = false;
      }
LAB_018de165:
      local_6a0 = auVar140;
      auVar214 = ZEXT3264(local_920);
      auVar206 = ZEXT3264(local_720);
      auVar165 = ZEXT464((uint)fVar146);
      local_6c0 = auVar162;
      if (8 < iVar101) {
        local_480._4_4_ = iVar101;
        local_480._0_4_ = iVar101;
        local_480._8_4_ = iVar101;
        local_480._12_4_ = iVar101;
        local_480._16_4_ = iVar101;
        local_480._20_4_ = iVar101;
        local_480._24_4_ = iVar101;
        local_480._28_4_ = iVar101;
        local_4e0._4_4_ = fVar146;
        local_4e0._0_4_ = fVar146;
        fStack_4d8 = fVar146;
        fStack_4d4 = fVar146;
        fStack_4d0 = fVar146;
        fStack_4cc = fVar146;
        fStack_4c8 = fVar146;
        fStack_4c4 = fVar146;
        local_120 = local_580._0_4_;
        uStack_11c = local_580._0_4_;
        uStack_118 = local_580._0_4_;
        uStack_114 = local_580._0_4_;
        uStack_110 = local_580._0_4_;
        uStack_10c = local_580._0_4_;
        uStack_108 = local_580._0_4_;
        uStack_104 = local_580._0_4_;
        local_140 = 1.0 / local_5c0;
        fStack_13c = local_140;
        fStack_138 = local_140;
        fStack_134 = local_140;
        fStack_130 = local_140;
        fStack_12c = local_140;
        fStack_128 = local_140;
        fStack_124 = local_140;
        local_5e0 = CONCAT44((undefined4)local_5e0,(undefined4)local_5e0);
        uStack_5d8 = (undefined4)local_5e0;
        uStack_5d4 = (undefined4)local_5e0;
        uStack_5d0 = (undefined4)local_5e0;
        uStack_5cc = (undefined4)local_5e0;
        uStack_5c8 = (undefined4)local_5e0;
        uStack_5c4 = (undefined4)local_5e0;
        lVar108 = 8;
        auVar6._8_8_ = uStack_5f8;
        auVar6._0_8_ = local_600;
        auVar6._16_8_ = uStack_5f0;
        auVar6._24_8_ = uStack_5e8;
        local_700 = auVar182;
        local_5c0 = (float)local_860._4_4_;
        uStack_5bc = local_860._4_4_;
        uStack_5b8 = local_860._4_4_;
        uStack_5b4 = local_860._4_4_;
        uStack_5b0 = local_860._4_4_;
        uStack_5ac = local_860._4_4_;
        uStack_5a8 = local_860._4_4_;
        uStack_5a4 = local_860._4_4_;
        do {
          auVar156 = auVar214._0_32_;
          auVar203 = auVar206._0_32_;
          auVar134 = *(undefined1 (*) [32])(bezier_basis0 + lVar108 * 4 + lVar24);
          auVar135 = *(undefined1 (*) [32])(lVar24 + 0x21aa768 + lVar108 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar24 + 0x21aabec + lVar108 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar24 + 0x21ab070 + lVar108 * 4);
          fVar129 = *(float *)*pauVar2;
          fVar130 = *(float *)(*pauVar2 + 4);
          fVar143 = *(float *)(*pauVar2 + 8);
          fVar222 = *(float *)(*pauVar2 + 0xc);
          fVar223 = *(float *)(*pauVar2 + 0x10);
          fVar224 = *(float *)(*pauVar2 + 0x14);
          fVar225 = *(float *)(*pauVar2 + 0x18);
          auVar95 = *(undefined1 (*) [28])*pauVar2;
          auVar213._0_4_ = fVar129 * auVar194._0_4_;
          auVar213._4_4_ = fVar130 * auVar194._4_4_;
          auVar213._8_4_ = fVar143 * auVar194._8_4_;
          auVar213._12_4_ = fVar222 * auVar194._12_4_;
          auVar213._16_4_ = fVar223 * auVar194._16_4_;
          auVar213._20_4_ = fVar224 * auVar194._20_4_;
          auVar213._28_36_ = auVar214._28_36_;
          auVar213._24_4_ = fVar225 * auVar194._24_4_;
          auVar206._0_4_ = fVar129 * auVar191._0_4_;
          auVar206._4_4_ = fVar130 * auVar191._4_4_;
          auVar206._8_4_ = fVar143 * auVar191._8_4_;
          auVar206._12_4_ = fVar222 * auVar191._12_4_;
          auVar206._16_4_ = fVar223 * auVar191._16_4_;
          auVar206._20_4_ = fVar224 * auVar191._20_4_;
          auVar206._28_36_ = auVar165._28_36_;
          auVar206._24_4_ = fVar225 * auVar191._24_4_;
          auVar21 = vfmadd231ps_fma(auVar213._0_32_,auVar120,auVar186);
          auVar22 = vfmadd231ps_fma(auVar206._0_32_,auVar120,auVar198);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar135,auVar230);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar135,auVar217);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar134,auVar221);
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar134,auVar6);
          auVar140 = *(undefined1 (*) [32])(bezier_basis1 + lVar108 * 4 + lVar24);
          auVar123 = *(undefined1 (*) [32])(lVar24 + 0x21acb88 + lVar108 * 4);
          auVar23 = *(undefined1 (*) [32])(lVar24 + 0x21ad00c + lVar108 * 4);
          pfVar1 = (float *)(lVar24 + 0x21ad490 + lVar108 * 4);
          fVar226 = *pfVar1;
          fVar227 = pfVar1[1];
          fVar85 = pfVar1[2];
          fVar86 = pfVar1[3];
          fVar87 = pfVar1[4];
          fVar88 = pfVar1[5];
          fVar89 = pfVar1[6];
          auVar219._0_4_ = fVar226 * auVar194._0_4_;
          auVar219._4_4_ = fVar227 * auVar194._4_4_;
          auVar219._8_4_ = fVar85 * auVar194._8_4_;
          auVar219._12_4_ = fVar86 * auVar194._12_4_;
          auVar219._16_4_ = fVar87 * auVar194._16_4_;
          auVar219._20_4_ = fVar88 * auVar194._20_4_;
          auVar219._28_36_ = auVar194._28_36_;
          auVar219._24_4_ = fVar89 * auVar194._24_4_;
          auVar214._0_4_ = fVar226 * auVar191._0_4_;
          auVar214._4_4_ = fVar227 * auVar191._4_4_;
          auVar214._8_4_ = fVar85 * auVar191._8_4_;
          auVar214._12_4_ = fVar86 * auVar191._12_4_;
          auVar214._16_4_ = fVar87 * auVar191._16_4_;
          auVar214._20_4_ = fVar88 * auVar191._20_4_;
          auVar214._28_36_ = auVar191._28_36_;
          auVar214._24_4_ = fVar89 * auVar191._24_4_;
          auVar8 = vfmadd231ps_fma(auVar219._0_32_,auVar23,auVar186);
          auVar9 = vfmadd231ps_fma(auVar214._0_32_,auVar23,auVar198);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar123,auVar230);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar123,auVar217);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar140,auVar221);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar140,auVar6);
          local_6e0 = ZEXT1632(auVar8);
          local_440 = ZEXT1632(auVar21);
          local_580 = vsubps_avx(local_6e0,local_440);
          auVar187 = ZEXT1632(auVar9);
          auVar162 = ZEXT1632(auVar22);
          local_420 = vsubps_avx(auVar187,auVar162);
          auVar84._4_4_ = auVar22._4_4_ * local_580._4_4_;
          auVar84._0_4_ = auVar22._0_4_ * local_580._0_4_;
          auVar84._8_4_ = auVar22._8_4_ * local_580._8_4_;
          auVar84._12_4_ = auVar22._12_4_ * local_580._12_4_;
          auVar84._16_4_ = local_580._16_4_ * 0.0;
          auVar84._20_4_ = local_580._20_4_ * 0.0;
          auVar84._24_4_ = local_580._24_4_ * 0.0;
          auVar84._28_4_ = auVar6._28_4_;
          fVar146 = local_420._0_4_;
          fVar145 = local_420._4_4_;
          auVar97._4_4_ = auVar21._4_4_ * fVar145;
          auVar97._0_4_ = auVar21._0_4_ * fVar146;
          fVar124 = local_420._8_4_;
          auVar97._8_4_ = auVar21._8_4_ * fVar124;
          fVar125 = local_420._12_4_;
          auVar97._12_4_ = auVar21._12_4_ * fVar125;
          fVar126 = local_420._16_4_;
          auVar97._16_4_ = fVar126 * 0.0;
          fVar127 = local_420._20_4_;
          auVar97._20_4_ = fVar127 * 0.0;
          fVar128 = local_420._24_4_;
          auVar97._24_4_ = fVar128 * 0.0;
          auVar97._28_4_ = auVar7._4_4_;
          auVar20 = vsubps_avx(auVar84,auVar97);
          auVar57._4_4_ = fVar130 * local_e0._4_4_;
          auVar57._0_4_ = fVar129 * (float)local_e0;
          auVar57._8_4_ = fVar143 * (float)uStack_d8;
          auVar57._12_4_ = fVar222 * uStack_d8._4_4_;
          auVar57._16_4_ = fVar223 * (float)uStack_d0;
          auVar57._20_4_ = fVar224 * uStack_d0._4_4_;
          auVar57._24_4_ = fVar225 * (float)uStack_c8;
          auVar57._28_4_ = auVar6._28_4_;
          auVar165 = ZEXT3264(local_c0);
          auVar21 = vfmadd231ps_fma(auVar57,auVar120,local_c0);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_700,auVar135);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_a0,auVar134);
          auVar188._0_4_ = fVar226 * (float)local_e0;
          auVar188._4_4_ = fVar227 * local_e0._4_4_;
          auVar188._8_4_ = fVar85 * (float)uStack_d8;
          auVar188._12_4_ = fVar86 * uStack_d8._4_4_;
          auVar188._16_4_ = fVar87 * (float)uStack_d0;
          auVar188._20_4_ = fVar88 * uStack_d0._4_4_;
          auVar188._24_4_ = fVar89 * (float)uStack_c8;
          auVar188._28_4_ = 0;
          local_5a0 = ZEXT1632(auVar21);
          auVar21 = vfmadd231ps_fma(auVar188,auVar23,local_c0);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar123,local_700);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar140,local_a0);
          auVar58._4_4_ = fVar145 * fVar145;
          auVar58._0_4_ = fVar146 * fVar146;
          auVar58._8_4_ = fVar124 * fVar124;
          auVar58._12_4_ = fVar125 * fVar125;
          auVar58._16_4_ = fVar126 * fVar126;
          auVar58._20_4_ = fVar127 * fVar127;
          auVar58._24_4_ = fVar128 * fVar128;
          auVar58._28_4_ = local_a0._28_4_;
          auVar22 = vfmadd231ps_fma(auVar58,local_580,local_580);
          auVar200 = vmaxps_avx(local_5a0,ZEXT1632(auVar21));
          auVar204._0_4_ = auVar200._0_4_ * auVar200._0_4_ * auVar22._0_4_;
          auVar204._4_4_ = auVar200._4_4_ * auVar200._4_4_ * auVar22._4_4_;
          auVar204._8_4_ = auVar200._8_4_ * auVar200._8_4_ * auVar22._8_4_;
          auVar204._12_4_ = auVar200._12_4_ * auVar200._12_4_ * auVar22._12_4_;
          auVar204._16_4_ = auVar200._16_4_ * auVar200._16_4_ * 0.0;
          auVar204._20_4_ = auVar200._20_4_ * auVar200._20_4_ * 0.0;
          auVar204._24_4_ = auVar200._24_4_ * auVar200._24_4_ * 0.0;
          auVar204._28_4_ = 0;
          auVar59._4_4_ = auVar20._4_4_ * auVar20._4_4_;
          auVar59._0_4_ = auVar20._0_4_ * auVar20._0_4_;
          auVar59._8_4_ = auVar20._8_4_ * auVar20._8_4_;
          auVar59._12_4_ = auVar20._12_4_ * auVar20._12_4_;
          auVar59._16_4_ = auVar20._16_4_ * auVar20._16_4_;
          auVar59._20_4_ = auVar20._20_4_ * auVar20._20_4_;
          auVar59._24_4_ = auVar20._24_4_ * auVar20._24_4_;
          auVar59._28_4_ = auVar20._28_4_;
          auVar200 = vcmpps_avx(auVar59,auVar204,2);
          local_340 = (int)lVar108;
          auVar205._4_4_ = local_340;
          auVar205._0_4_ = local_340;
          auVar205._8_4_ = local_340;
          auVar205._12_4_ = local_340;
          auVar205._16_4_ = local_340;
          auVar205._20_4_ = local_340;
          auVar205._24_4_ = local_340;
          auVar205._28_4_ = local_340;
          auVar20 = vpor_avx2(auVar205,_DAT_01fe9900);
          auVar122 = vpcmpgtd_avx2(local_480,auVar20);
          auVar20 = auVar122 & auVar200;
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar20 >> 0x7f,0) == '\0') &&
                (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar20 >> 0xbf,0) == '\0') &&
              (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar20[0x1f]) {
            auVar206 = ZEXT3264(auVar203);
            auVar214 = ZEXT3264(auVar156);
LAB_018defa8:
            auVar191 = ZEXT3264(CONCAT428(fVar166,CONCAT424(fVar144,CONCAT420(fVar166,CONCAT416(
                                                  fVar144,CONCAT412(fVar166,CONCAT48(fVar144,uVar110
                                                                                    )))))));
            auVar194 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,CONCAT416(
                                                  fVar209,CONCAT412(fVar209,CONCAT48(fVar209,
                                                  CONCAT44(fVar209,fVar209))))))));
          }
          else {
            _local_4a0 = vandps_avx(auVar122,auVar200);
            auVar60._4_4_ = fVar227 * local_560._4_4_;
            auVar60._0_4_ = fVar226 * (float)local_560;
            auVar60._8_4_ = fVar85 * (float)uStack_558;
            auVar60._12_4_ = fVar86 * uStack_558._4_4_;
            auVar60._16_4_ = fVar87 * (float)uStack_550;
            auVar60._20_4_ = fVar88 * uStack_550._4_4_;
            auVar60._24_4_ = fVar89 * (float)uStack_548;
            auVar60._28_4_ = auVar200._28_4_;
            auVar22 = vfmadd213ps_fma(auVar23,local_100,auVar60);
            auVar22 = vfmadd213ps_fma(auVar123,local_540,ZEXT1632(auVar22));
            auVar22 = vfmadd132ps_fma(auVar140,ZEXT1632(auVar22),local_620);
            local_4c0 = ZEXT1632(auVar22);
            local_460._0_4_ = auVar95._0_4_;
            local_460._4_4_ = auVar95._4_4_;
            fStack_458 = auVar95._8_4_;
            fStack_454 = auVar95._12_4_;
            fStack_450 = auVar95._16_4_;
            fStack_44c = auVar95._20_4_;
            fStack_448 = auVar95._24_4_;
            auVar172._0_4_ = (float)local_560 * (float)local_460._0_4_;
            auVar172._4_4_ = local_560._4_4_ * (float)local_460._4_4_;
            auVar172._8_4_ = (float)uStack_558 * fStack_458;
            auVar172._12_4_ = uStack_558._4_4_ * fStack_454;
            auVar172._16_4_ = (float)uStack_550 * fStack_450;
            auVar172._20_4_ = uStack_550._4_4_ * fStack_44c;
            auVar172._24_4_ = (float)uStack_548 * fStack_448;
            auVar172._28_4_ = 0;
            auVar22 = vfmadd213ps_fma(auVar120,local_100,auVar172);
            auVar22 = vfmadd213ps_fma(auVar135,local_540,ZEXT1632(auVar22));
            auVar135 = *(undefined1 (*) [32])(lVar24 + 0x21ab4f4 + lVar108 * 4);
            auVar120 = *(undefined1 (*) [32])(lVar24 + 0x21ab978 + lVar108 * 4);
            auVar140 = *(undefined1 (*) [32])(lVar24 + 0x21abdfc + lVar108 * 4);
            pfVar3 = (float *)(lVar24 + 0x21ac280 + lVar108 * 4);
            fVar146 = *pfVar3;
            fVar145 = pfVar3[1];
            fVar124 = pfVar3[2];
            fVar125 = pfVar3[3];
            fVar126 = pfVar3[4];
            fVar127 = pfVar3[5];
            fVar128 = pfVar3[6];
            auVar61._4_4_ = fVar209 * fVar145;
            auVar61._0_4_ = fVar209 * fVar146;
            auVar61._8_4_ = fVar209 * fVar124;
            auVar61._12_4_ = fVar209 * fVar125;
            auVar61._16_4_ = fVar209 * fVar126;
            auVar61._20_4_ = fVar209 * fVar127;
            auVar61._24_4_ = fVar209 * fVar128;
            auVar61._28_4_ = pfVar1[7];
            auVar211._0_4_ = fVar144 * fVar146;
            auVar211._4_4_ = fVar166 * fVar145;
            auVar211._8_4_ = fVar144 * fVar124;
            auVar211._12_4_ = fVar166 * fVar125;
            auVar211._16_4_ = fVar144 * fVar126;
            auVar211._20_4_ = fVar166 * fVar127;
            auVar211._24_4_ = fVar144 * fVar128;
            auVar211._28_4_ = 0;
            auVar62._4_4_ = fVar145 * local_560._4_4_;
            auVar62._0_4_ = fVar146 * (float)local_560;
            auVar62._8_4_ = fVar124 * (float)uStack_558;
            auVar62._12_4_ = fVar125 * uStack_558._4_4_;
            auVar62._16_4_ = fVar126 * (float)uStack_550;
            auVar62._20_4_ = fVar127 * uStack_550._4_4_;
            auVar62._24_4_ = fVar128 * (float)uStack_548;
            auVar62._28_4_ = pfVar3[7];
            auVar8 = vfmadd231ps_fma(auVar61,auVar140,auVar186);
            auVar9 = vfmadd231ps_fma(auVar211,auVar140,auVar198);
            auVar10 = vfmadd231ps_fma(auVar62,local_100,auVar140);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar120,auVar230);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar120,auVar217);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),local_540,auVar120);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar135,auVar221);
            auVar92._8_8_ = uStack_5f8;
            auVar92._0_8_ = local_600;
            auVar92._16_8_ = uStack_5f0;
            auVar92._24_8_ = uStack_5e8;
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar135,auVar92);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar135,local_620);
            pfVar1 = (float *)(lVar24 + 0x21ae6a0 + lVar108 * 4);
            fVar146 = *pfVar1;
            fVar145 = pfVar1[1];
            fVar124 = pfVar1[2];
            fVar125 = pfVar1[3];
            fVar126 = pfVar1[4];
            fVar127 = pfVar1[5];
            fVar128 = pfVar1[6];
            auVar63._4_4_ = fVar209 * fVar145;
            auVar63._0_4_ = fVar209 * fVar146;
            auVar63._8_4_ = fVar209 * fVar124;
            auVar63._12_4_ = fVar209 * fVar125;
            auVar63._16_4_ = fVar209 * fVar126;
            auVar63._20_4_ = fVar209 * fVar127;
            auVar63._24_4_ = fVar209 * fVar128;
            auVar63._28_4_ = fVar209;
            auVar64._4_4_ = fVar166 * fVar145;
            auVar64._0_4_ = fVar144 * fVar146;
            auVar64._8_4_ = fVar144 * fVar124;
            auVar64._12_4_ = fVar166 * fVar125;
            auVar64._16_4_ = fVar144 * fVar126;
            auVar64._20_4_ = fVar166 * fVar127;
            auVar64._24_4_ = fVar144 * fVar128;
            auVar64._28_4_ = fVar166;
            auVar65._4_4_ = local_560._4_4_ * fVar145;
            auVar65._0_4_ = (float)local_560 * fVar146;
            auVar65._8_4_ = (float)uStack_558 * fVar124;
            auVar65._12_4_ = uStack_558._4_4_ * fVar125;
            auVar65._16_4_ = (float)uStack_550 * fVar126;
            auVar65._20_4_ = uStack_550._4_4_ * fVar127;
            auVar65._24_4_ = (float)uStack_548 * fVar128;
            auVar65._28_4_ = pfVar1[7];
            auVar135 = *(undefined1 (*) [32])(lVar24 + 0x21ae21c + lVar108 * 4);
            auVar13 = vfmadd231ps_fma(auVar63,auVar135,auVar186);
            auVar111 = vfmadd231ps_fma(auVar64,auVar135,auVar198);
            auVar147 = vfmadd231ps_fma(auVar65,local_100,auVar135);
            auVar135 = *(undefined1 (*) [32])(lVar24 + 0x21add98 + lVar108 * 4);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar135,auVar230);
            auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar135,auVar217);
            auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),local_540,auVar135);
            auVar135 = *(undefined1 (*) [32])(lVar24 + 0x21ad914 + lVar108 * 4);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar135,auVar221);
            auVar93._8_8_ = uStack_5f8;
            auVar93._0_8_ = local_600;
            auVar93._16_8_ = uStack_5f0;
            auVar93._24_8_ = uStack_5e8;
            auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),auVar135,auVar93);
            auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),local_620,auVar135);
            auVar135 = vandps_avx(ZEXT1632(auVar8),local_3c0);
            auVar120 = vandps_avx(ZEXT1632(auVar9),local_3c0);
            auVar120 = vmaxps_avx(auVar135,auVar120);
            auVar135 = vandps_avx(ZEXT1632(auVar10),local_3c0);
            auVar135 = vmaxps_avx(auVar120,auVar135);
            auVar135 = vcmpps_avx(auVar135,_local_4e0,1);
            auVar140 = vblendvps_avx(ZEXT1632(auVar8),local_580,auVar135);
            auVar123 = vblendvps_avx(ZEXT1632(auVar9),local_420,auVar135);
            auVar135 = vandps_avx(ZEXT1632(auVar13),local_3c0);
            auVar120 = vandps_avx(ZEXT1632(auVar111),local_3c0);
            auVar120 = vmaxps_avx(auVar135,auVar120);
            auVar135 = vandps_avx(local_3c0,ZEXT1632(auVar147));
            auVar135 = vmaxps_avx(auVar120,auVar135);
            auVar120 = vcmpps_avx(auVar135,_local_4e0,1);
            auVar135 = vblendvps_avx(ZEXT1632(auVar13),local_580,auVar120);
            auVar120 = vblendvps_avx(ZEXT1632(auVar111),local_420,auVar120);
            auVar22 = vfmadd213ps_fma(auVar134,local_620,ZEXT1632(auVar22));
            auVar8 = vfmadd213ps_fma(auVar140,auVar140,ZEXT832(0) << 0x20);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar123,auVar123);
            auVar134 = vrsqrtps_avx(ZEXT1632(auVar8));
            fVar146 = auVar134._0_4_;
            fVar145 = auVar134._4_4_;
            fVar124 = auVar134._8_4_;
            fVar125 = auVar134._12_4_;
            fVar126 = auVar134._16_4_;
            fVar127 = auVar134._20_4_;
            fVar128 = auVar134._24_4_;
            auVar66._4_4_ = fVar145 * fVar145 * fVar145 * auVar8._4_4_ * -0.5;
            auVar66._0_4_ = fVar146 * fVar146 * fVar146 * auVar8._0_4_ * -0.5;
            auVar66._8_4_ = fVar124 * fVar124 * fVar124 * auVar8._8_4_ * -0.5;
            auVar66._12_4_ = fVar125 * fVar125 * fVar125 * auVar8._12_4_ * -0.5;
            auVar66._16_4_ = fVar126 * fVar126 * fVar126 * -0.0;
            auVar66._20_4_ = fVar127 * fVar127 * fVar127 * -0.0;
            auVar66._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
            auVar66._28_4_ = 0;
            auVar178._8_4_ = 0x3fc00000;
            auVar178._0_8_ = 0x3fc000003fc00000;
            auVar178._12_4_ = 0x3fc00000;
            auVar178._16_4_ = 0x3fc00000;
            auVar178._20_4_ = 0x3fc00000;
            auVar178._24_4_ = 0x3fc00000;
            auVar178._28_4_ = 0x3fc00000;
            auVar8 = vfmadd231ps_fma(auVar66,auVar178,auVar134);
            fVar146 = auVar8._0_4_;
            fVar145 = auVar8._4_4_;
            auVar67._4_4_ = auVar123._4_4_ * fVar145;
            auVar67._0_4_ = auVar123._0_4_ * fVar146;
            fVar124 = auVar8._8_4_;
            auVar67._8_4_ = auVar123._8_4_ * fVar124;
            fVar125 = auVar8._12_4_;
            auVar67._12_4_ = auVar123._12_4_ * fVar125;
            auVar67._16_4_ = auVar123._16_4_ * 0.0;
            auVar67._20_4_ = auVar123._20_4_ * 0.0;
            auVar67._24_4_ = auVar123._24_4_ * 0.0;
            auVar67._28_4_ = auVar123._28_4_;
            auVar68._4_4_ = fVar145 * -auVar140._4_4_;
            auVar68._0_4_ = fVar146 * -auVar140._0_4_;
            auVar68._8_4_ = fVar124 * -auVar140._8_4_;
            auVar68._12_4_ = fVar125 * -auVar140._12_4_;
            auVar68._16_4_ = -auVar140._16_4_ * 0.0;
            auVar68._20_4_ = -auVar140._20_4_ * 0.0;
            auVar68._24_4_ = -auVar140._24_4_ * 0.0;
            auVar68._28_4_ = auVar134._28_4_;
            auVar8 = vfmadd213ps_fma(auVar135,auVar135,ZEXT832(0) << 0x20);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar120,auVar120);
            auVar134 = vrsqrtps_avx(ZEXT1632(auVar8));
            auVar69._28_4_ = local_420._28_4_;
            auVar69._0_28_ =
                 ZEXT1628(CONCAT412(fVar125 * 0.0,
                                    CONCAT48(fVar124 * 0.0,CONCAT44(fVar145 * 0.0,fVar146 * 0.0))));
            fVar146 = auVar134._0_4_;
            fVar145 = auVar134._4_4_;
            fVar124 = auVar134._8_4_;
            fVar125 = auVar134._12_4_;
            fVar126 = auVar134._16_4_;
            fVar127 = auVar134._20_4_;
            fVar128 = auVar134._24_4_;
            auVar70._4_4_ = fVar145 * fVar145 * fVar145 * auVar8._4_4_ * -0.5;
            auVar70._0_4_ = fVar146 * fVar146 * fVar146 * auVar8._0_4_ * -0.5;
            auVar70._8_4_ = fVar124 * fVar124 * fVar124 * auVar8._8_4_ * -0.5;
            auVar70._12_4_ = fVar125 * fVar125 * fVar125 * auVar8._12_4_ * -0.5;
            auVar70._16_4_ = fVar126 * fVar126 * fVar126 * -0.0;
            auVar70._20_4_ = fVar127 * fVar127 * fVar127 * -0.0;
            auVar70._24_4_ = fVar128 * fVar128 * fVar128 * -0.0;
            auVar70._28_4_ = 0;
            auVar8 = vfmadd231ps_fma(auVar70,auVar178,auVar134);
            fVar146 = auVar8._0_4_;
            fVar145 = auVar8._4_4_;
            auVar71._4_4_ = auVar120._4_4_ * fVar145;
            auVar71._0_4_ = auVar120._0_4_ * fVar146;
            fVar124 = auVar8._8_4_;
            auVar71._8_4_ = auVar120._8_4_ * fVar124;
            fVar125 = auVar8._12_4_;
            auVar71._12_4_ = auVar120._12_4_ * fVar125;
            auVar71._16_4_ = auVar120._16_4_ * 0.0;
            auVar71._20_4_ = auVar120._20_4_ * 0.0;
            auVar71._24_4_ = auVar120._24_4_ * 0.0;
            auVar71._28_4_ = 0;
            auVar72._4_4_ = fVar145 * -auVar135._4_4_;
            auVar72._0_4_ = fVar146 * -auVar135._0_4_;
            auVar72._8_4_ = fVar124 * -auVar135._8_4_;
            auVar72._12_4_ = fVar125 * -auVar135._12_4_;
            auVar72._16_4_ = -auVar135._16_4_ * 0.0;
            auVar72._20_4_ = -auVar135._20_4_ * 0.0;
            auVar72._24_4_ = -auVar135._24_4_ * 0.0;
            auVar72._28_4_ = 0;
            auVar73._28_4_ = 0xbf000000;
            auVar73._0_28_ =
                 ZEXT1628(CONCAT412(fVar125 * 0.0,
                                    CONCAT48(fVar124 * 0.0,CONCAT44(fVar145 * 0.0,fVar146 * 0.0))));
            auVar8 = vfmadd213ps_fma(auVar67,local_5a0,local_440);
            auVar9 = vfmadd213ps_fma(auVar68,local_5a0,auVar162);
            auVar10 = vfmadd213ps_fma(auVar69,local_5a0,ZEXT1632(auVar22));
            auVar25 = vfnmadd213ps_fma(auVar67,local_5a0,local_440);
            auVar13 = vfmadd213ps_fma(auVar71,ZEXT1632(auVar21),local_6e0);
            auVar133 = vfnmadd213ps_fma(auVar68,local_5a0,auVar162);
            auVar134 = ZEXT1632(auVar21);
            auVar111 = vfmadd213ps_fma(auVar72,auVar134,auVar187);
            auVar22 = vfnmadd231ps_fma(ZEXT1632(auVar22),local_5a0,auVar69);
            auVar147 = vfmadd213ps_fma(auVar73,auVar134,local_4c0);
            auVar148 = vfnmadd213ps_fma(auVar71,auVar134,local_6e0);
            auVar149 = vfnmadd213ps_fma(auVar72,auVar134,auVar187);
            auVar167 = vfnmadd231ps_fma(local_4c0,ZEXT1632(auVar21),auVar73);
            auVar134 = vsubps_avx(ZEXT1632(auVar111),ZEXT1632(auVar133));
            auVar135 = vsubps_avx(ZEXT1632(auVar147),ZEXT1632(auVar22));
            auVar189._0_4_ = auVar134._0_4_ * auVar22._0_4_;
            auVar189._4_4_ = auVar134._4_4_ * auVar22._4_4_;
            auVar189._8_4_ = auVar134._8_4_ * auVar22._8_4_;
            auVar189._12_4_ = auVar134._12_4_ * auVar22._12_4_;
            auVar189._16_4_ = auVar134._16_4_ * 0.0;
            auVar189._20_4_ = auVar134._20_4_ * 0.0;
            auVar189._24_4_ = auVar134._24_4_ * 0.0;
            auVar189._28_4_ = 0;
            auVar112 = vfmsub231ps_fma(auVar189,ZEXT1632(auVar133),auVar135);
            auVar74._4_4_ = auVar25._4_4_ * auVar135._4_4_;
            auVar74._0_4_ = auVar25._0_4_ * auVar135._0_4_;
            auVar74._8_4_ = auVar25._8_4_ * auVar135._8_4_;
            auVar74._12_4_ = auVar25._12_4_ * auVar135._12_4_;
            auVar74._16_4_ = auVar135._16_4_ * 0.0;
            auVar74._20_4_ = auVar135._20_4_ * 0.0;
            auVar74._24_4_ = auVar135._24_4_ * 0.0;
            auVar74._28_4_ = auVar135._28_4_;
            auVar200 = ZEXT1632(auVar25);
            auVar135 = vsubps_avx(ZEXT1632(auVar13),auVar200);
            auVar122 = ZEXT1632(auVar22);
            auVar22 = vfmsub231ps_fma(auVar74,auVar122,auVar135);
            auVar75._4_4_ = auVar133._4_4_ * auVar135._4_4_;
            auVar75._0_4_ = auVar133._0_4_ * auVar135._0_4_;
            auVar75._8_4_ = auVar133._8_4_ * auVar135._8_4_;
            auVar75._12_4_ = auVar133._12_4_ * auVar135._12_4_;
            auVar75._16_4_ = auVar135._16_4_ * 0.0;
            auVar75._20_4_ = auVar135._20_4_ * 0.0;
            auVar75._24_4_ = auVar135._24_4_ * 0.0;
            auVar75._28_4_ = auVar135._28_4_;
            auVar25 = vfmsub231ps_fma(auVar75,auVar200,auVar134);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar25),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar112));
            auVar162 = vcmpps_avx(ZEXT1632(auVar22),ZEXT832(0) << 0x20,2);
            auVar134 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar8),auVar162);
            auVar135 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar9),auVar162);
            auVar120 = vblendvps_avx(ZEXT1632(auVar167),ZEXT1632(auVar10),auVar162);
            auVar140 = vblendvps_avx(auVar200,ZEXT1632(auVar13),auVar162);
            auVar123 = vblendvps_avx(ZEXT1632(auVar133),ZEXT1632(auVar111),auVar162);
            auVar23 = vblendvps_avx(auVar122,ZEXT1632(auVar147),auVar162);
            auVar200 = vblendvps_avx(ZEXT1632(auVar13),auVar200,auVar162);
            auVar20 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar133),auVar162);
            auVar22 = vpackssdw_avx(local_4a0._0_16_,local_4a0._16_16_);
            auVar122 = vblendvps_avx(ZEXT1632(auVar147),auVar122,auVar162);
            auVar200 = vsubps_avx(auVar200,auVar134);
            auVar20 = vsubps_avx(auVar20,auVar135);
            auVar187 = vsubps_avx(auVar122,auVar120);
            auVar157 = vsubps_avx(auVar134,auVar140);
            auVar170 = vsubps_avx(auVar135,auVar123);
            auVar171 = vsubps_avx(auVar120,auVar23);
            auVar183._0_4_ = auVar187._0_4_ * auVar134._0_4_;
            auVar183._4_4_ = auVar187._4_4_ * auVar134._4_4_;
            auVar183._8_4_ = auVar187._8_4_ * auVar134._8_4_;
            auVar183._12_4_ = auVar187._12_4_ * auVar134._12_4_;
            auVar183._16_4_ = auVar187._16_4_ * auVar134._16_4_;
            auVar183._20_4_ = auVar187._20_4_ * auVar134._20_4_;
            auVar183._24_4_ = auVar187._24_4_ * auVar134._24_4_;
            auVar183._28_4_ = 0;
            auVar8 = vfmsub231ps_fma(auVar183,auVar120,auVar200);
            auVar76._4_4_ = auVar200._4_4_ * auVar135._4_4_;
            auVar76._0_4_ = auVar200._0_4_ * auVar135._0_4_;
            auVar76._8_4_ = auVar200._8_4_ * auVar135._8_4_;
            auVar76._12_4_ = auVar200._12_4_ * auVar135._12_4_;
            auVar76._16_4_ = auVar200._16_4_ * auVar135._16_4_;
            auVar76._20_4_ = auVar200._20_4_ * auVar135._20_4_;
            auVar76._24_4_ = auVar200._24_4_ * auVar135._24_4_;
            auVar76._28_4_ = auVar122._28_4_;
            auVar9 = vfmsub231ps_fma(auVar76,auVar134,auVar20);
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
            auVar184._0_4_ = auVar20._0_4_ * auVar120._0_4_;
            auVar184._4_4_ = auVar20._4_4_ * auVar120._4_4_;
            auVar184._8_4_ = auVar20._8_4_ * auVar120._8_4_;
            auVar184._12_4_ = auVar20._12_4_ * auVar120._12_4_;
            auVar184._16_4_ = auVar20._16_4_ * auVar120._16_4_;
            auVar184._20_4_ = auVar20._20_4_ * auVar120._20_4_;
            auVar184._24_4_ = auVar20._24_4_ * auVar120._24_4_;
            auVar184._28_4_ = 0;
            auVar9 = vfmsub231ps_fma(auVar184,auVar135,auVar187);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
            auVar165 = ZEXT1664(auVar9);
            auVar185._0_4_ = auVar171._0_4_ * auVar140._0_4_;
            auVar185._4_4_ = auVar171._4_4_ * auVar140._4_4_;
            auVar185._8_4_ = auVar171._8_4_ * auVar140._8_4_;
            auVar185._12_4_ = auVar171._12_4_ * auVar140._12_4_;
            auVar185._16_4_ = auVar171._16_4_ * auVar140._16_4_;
            auVar185._20_4_ = auVar171._20_4_ * auVar140._20_4_;
            auVar185._24_4_ = auVar171._24_4_ * auVar140._24_4_;
            auVar185._28_4_ = 0;
            auVar8 = vfmsub231ps_fma(auVar185,auVar157,auVar23);
            auVar77._4_4_ = auVar170._4_4_ * auVar23._4_4_;
            auVar77._0_4_ = auVar170._0_4_ * auVar23._0_4_;
            auVar77._8_4_ = auVar170._8_4_ * auVar23._8_4_;
            auVar77._12_4_ = auVar170._12_4_ * auVar23._12_4_;
            auVar77._16_4_ = auVar170._16_4_ * auVar23._16_4_;
            auVar77._20_4_ = auVar170._20_4_ * auVar23._20_4_;
            auVar77._24_4_ = auVar170._24_4_ * auVar23._24_4_;
            auVar77._28_4_ = auVar134._28_4_;
            auVar10 = vfmsub231ps_fma(auVar77,auVar123,auVar171);
            auVar78._4_4_ = auVar157._4_4_ * auVar123._4_4_;
            auVar78._0_4_ = auVar157._0_4_ * auVar123._0_4_;
            auVar78._8_4_ = auVar157._8_4_ * auVar123._8_4_;
            auVar78._12_4_ = auVar157._12_4_ * auVar123._12_4_;
            auVar78._16_4_ = auVar157._16_4_ * auVar123._16_4_;
            auVar78._20_4_ = auVar157._20_4_ * auVar123._20_4_;
            auVar78._24_4_ = auVar157._24_4_ * auVar123._24_4_;
            auVar78._28_4_ = auVar123._28_4_;
            auVar13 = vfmsub231ps_fma(auVar78,auVar170,auVar140);
            auVar123 = ZEXT832(0) << 0x20;
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar123,ZEXT1632(auVar8));
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar123,ZEXT1632(auVar10));
            auVar140 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
            auVar140 = vcmpps_avx(auVar140,auVar123,2);
            auVar8 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
            auVar8 = vpand_avx(auVar8,auVar22);
            auVar140 = vpmovsxwd_avx2(auVar8);
            if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar140 >> 0x7f,0) == '\0') &&
                  (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar140 >> 0xbf,0) == '\0') &&
                (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar140[0x1f]) {
LAB_018df4e3:
              auVar174._8_8_ = uStack_638;
              auVar174._0_8_ = local_640;
              auVar174._16_8_ = uStack_630;
              auVar174._24_8_ = uStack_628;
              auVar206 = ZEXT3264(auVar203);
              auVar214 = ZEXT3264(auVar156);
            }
            else {
              auVar79._4_4_ = auVar20._4_4_ * auVar171._4_4_;
              auVar79._0_4_ = auVar20._0_4_ * auVar171._0_4_;
              auVar79._8_4_ = auVar20._8_4_ * auVar171._8_4_;
              auVar79._12_4_ = auVar20._12_4_ * auVar171._12_4_;
              auVar79._16_4_ = auVar20._16_4_ * auVar171._16_4_;
              auVar79._20_4_ = auVar20._20_4_ * auVar171._20_4_;
              auVar79._24_4_ = auVar20._24_4_ * auVar171._24_4_;
              auVar79._28_4_ = auVar140._28_4_;
              auVar112 = vfmsub231ps_fma(auVar79,auVar170,auVar187);
              auVar190._0_4_ = auVar187._0_4_ * auVar157._0_4_;
              auVar190._4_4_ = auVar187._4_4_ * auVar157._4_4_;
              auVar190._8_4_ = auVar187._8_4_ * auVar157._8_4_;
              auVar190._12_4_ = auVar187._12_4_ * auVar157._12_4_;
              auVar190._16_4_ = auVar187._16_4_ * auVar157._16_4_;
              auVar190._20_4_ = auVar187._20_4_ * auVar157._20_4_;
              auVar190._24_4_ = auVar187._24_4_ * auVar157._24_4_;
              auVar190._28_4_ = 0;
              auVar147 = vfmsub231ps_fma(auVar190,auVar200,auVar171);
              auVar80._4_4_ = auVar200._4_4_ * auVar170._4_4_;
              auVar80._0_4_ = auVar200._0_4_ * auVar170._0_4_;
              auVar80._8_4_ = auVar200._8_4_ * auVar170._8_4_;
              auVar80._12_4_ = auVar200._12_4_ * auVar170._12_4_;
              auVar80._16_4_ = auVar200._16_4_ * auVar170._16_4_;
              auVar80._20_4_ = auVar200._20_4_ * auVar170._20_4_;
              auVar80._24_4_ = auVar200._24_4_ * auVar170._24_4_;
              auVar80._28_4_ = auVar170._28_4_;
              auVar25 = vfmsub231ps_fma(auVar80,auVar157,auVar20);
              auVar13 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar147),ZEXT1632(auVar25));
              auVar111 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar112),auVar123);
              auVar140 = vrcpps_avx(ZEXT1632(auVar111));
              auVar212._8_4_ = 0x3f800000;
              auVar212._0_8_ = 0x3f8000003f800000;
              auVar212._12_4_ = 0x3f800000;
              auVar212._16_4_ = 0x3f800000;
              auVar212._20_4_ = 0x3f800000;
              auVar212._24_4_ = 0x3f800000;
              auVar212._28_4_ = 0x3f800000;
              auVar13 = vfnmadd213ps_fma(auVar140,ZEXT1632(auVar111),auVar212);
              auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar140,auVar140);
              auVar81._4_4_ = auVar25._4_4_ * auVar120._4_4_;
              auVar81._0_4_ = auVar25._0_4_ * auVar120._0_4_;
              auVar81._8_4_ = auVar25._8_4_ * auVar120._8_4_;
              auVar81._12_4_ = auVar25._12_4_ * auVar120._12_4_;
              auVar81._16_4_ = auVar120._16_4_ * 0.0;
              auVar81._20_4_ = auVar120._20_4_ * 0.0;
              auVar81._24_4_ = auVar120._24_4_ * 0.0;
              auVar81._28_4_ = auVar135._28_4_;
              auVar147 = vfmadd231ps_fma(auVar81,ZEXT1632(auVar147),auVar135);
              auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),ZEXT1632(auVar112),auVar134);
              fVar146 = auVar13._0_4_;
              fVar145 = auVar13._4_4_;
              fVar124 = auVar13._8_4_;
              fVar125 = auVar13._12_4_;
              auVar120 = ZEXT1632(CONCAT412(fVar125 * auVar147._12_4_,
                                            CONCAT48(fVar124 * auVar147._8_4_,
                                                     CONCAT44(fVar145 * auVar147._4_4_,
                                                              fVar146 * auVar147._0_4_))));
              uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar173._4_4_ = uVar109;
              auVar173._0_4_ = uVar109;
              auVar173._8_4_ = uVar109;
              auVar173._12_4_ = uVar109;
              auVar173._16_4_ = uVar109;
              auVar173._20_4_ = uVar109;
              auVar173._24_4_ = uVar109;
              auVar173._28_4_ = uVar109;
              auVar94._4_4_ = uStack_11c;
              auVar94._0_4_ = local_120;
              auVar94._8_4_ = uStack_118;
              auVar94._12_4_ = uStack_114;
              auVar94._16_4_ = uStack_110;
              auVar94._20_4_ = uStack_10c;
              auVar94._24_4_ = uStack_108;
              auVar94._28_4_ = uStack_104;
              auVar134 = vcmpps_avx(auVar94,auVar120,2);
              auVar135 = vcmpps_avx(auVar120,auVar173,2);
              auVar134 = vandps_avx(auVar135,auVar134);
              auVar13 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
              auVar8 = vpand_avx(auVar8,auVar13);
              auVar134 = vpmovsxwd_avx2(auVar8);
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar134 >> 0x7f,0) == '\0') &&
                    (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar134 >> 0xbf,0) == '\0') &&
                  (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar134[0x1f]) goto LAB_018df4e3;
              auVar134 = vcmpps_avx(ZEXT1632(auVar111),ZEXT832(0) << 0x20,4);
              auVar13 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
              auVar8 = vpand_avx(auVar8,auVar13);
              auVar134 = vpmovsxwd_avx2(auVar8);
              auVar174._8_8_ = uStack_638;
              auVar174._0_8_ = local_640;
              auVar174._16_8_ = uStack_630;
              auVar174._24_8_ = uStack_628;
              auVar206 = ZEXT3264(auVar203);
              auVar214 = ZEXT3264(auVar156);
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar134 >> 0x7f,0) != '\0') ||
                    (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar134 >> 0xbf,0) != '\0') ||
                  (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar134[0x1f] < '\0') {
                auVar140 = ZEXT1632(CONCAT412(fVar125 * auVar9._12_4_,
                                              CONCAT48(fVar124 * auVar9._8_4_,
                                                       CONCAT44(fVar145 * auVar9._4_4_,
                                                                fVar146 * auVar9._0_4_))));
                auVar82._28_4_ = SUB84(uStack_628,4);
                auVar82._0_28_ =
                     ZEXT1628(CONCAT412(fVar125 * auVar10._12_4_,
                                        CONCAT48(fVar124 * auVar10._8_4_,
                                                 CONCAT44(fVar145 * auVar10._4_4_,
                                                          fVar146 * auVar10._0_4_))));
                auVar201._8_4_ = 0x3f800000;
                auVar201._0_8_ = 0x3f8000003f800000;
                auVar201._12_4_ = 0x3f800000;
                auVar201._16_4_ = 0x3f800000;
                auVar201._20_4_ = 0x3f800000;
                auVar201._24_4_ = 0x3f800000;
                auVar201._28_4_ = 0x3f800000;
                auVar135 = vsubps_avx(auVar201,auVar140);
                auVar135 = vblendvps_avx(auVar135,auVar140,auVar162);
                auVar206 = ZEXT3264(auVar135);
                auVar135 = vsubps_avx(auVar201,auVar82);
                local_520 = vblendvps_avx(auVar135,auVar82,auVar162);
                auVar165 = ZEXT3264(local_520);
                auVar214 = ZEXT3264(auVar120);
                auVar174 = auVar134;
              }
            }
            if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar174 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar174 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar174 >> 0x7f,0) == '\0') &&
                  (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar174 >> 0xbf,0) == '\0') &&
                (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar174[0x1f]) goto LAB_018defa8;
            auVar134 = vsubps_avx(ZEXT1632(auVar21),local_5a0);
            local_720 = auVar206._0_32_;
            auVar8 = vfmadd213ps_fma(auVar134,local_720,local_5a0);
            fVar146 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar83._4_4_ = (auVar8._4_4_ + auVar8._4_4_) * fVar146;
            auVar83._0_4_ = (auVar8._0_4_ + auVar8._0_4_) * fVar146;
            auVar83._8_4_ = (auVar8._8_4_ + auVar8._8_4_) * fVar146;
            auVar83._12_4_ = (auVar8._12_4_ + auVar8._12_4_) * fVar146;
            auVar83._16_4_ = fVar146 * 0.0;
            auVar83._20_4_ = fVar146 * 0.0;
            auVar83._24_4_ = fVar146 * 0.0;
            auVar83._28_4_ = fVar146;
            auVar120 = auVar214._0_32_;
            auVar134 = vcmpps_avx(auVar120,auVar83,6);
            auVar135 = auVar174 & auVar134;
            auVar191 = ZEXT3264(CONCAT428(fVar166,CONCAT424(fVar144,CONCAT420(fVar166,CONCAT416(
                                                  fVar144,CONCAT412(fVar166,CONCAT48(fVar144,uVar110
                                                                                    )))))));
            auVar194 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,CONCAT416(
                                                  fVar209,CONCAT412(fVar209,CONCAT48(fVar209,
                                                  CONCAT44(fVar209,fVar209))))))));
            if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar135 >> 0x7f,0) != '\0') ||
                  (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar135 >> 0xbf,0) != '\0') ||
                (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar135[0x1f] < '\0') {
              auVar142._8_4_ = 0xbf800000;
              auVar142._0_8_ = 0xbf800000bf800000;
              auVar142._12_4_ = 0xbf800000;
              auVar142._16_4_ = 0xbf800000;
              auVar142._20_4_ = 0xbf800000;
              auVar142._24_4_ = 0xbf800000;
              auVar142._28_4_ = 0xbf800000;
              auVar163._8_4_ = 0x40000000;
              auVar163._0_8_ = 0x4000000040000000;
              auVar163._12_4_ = 0x40000000;
              auVar163._16_4_ = 0x40000000;
              auVar163._20_4_ = 0x40000000;
              auVar163._24_4_ = 0x40000000;
              auVar163._28_4_ = 0x40000000;
              auVar165 = ZEXT3264(auVar163);
              auVar8 = vfmadd213ps_fma(local_520,auVar163,auVar142);
              local_380 = ZEXT1632(auVar8);
              local_330 = local_770;
              uStack_328 = uStack_768;
              local_320 = local_780;
              uStack_318 = uStack_778;
              local_310 = local_790;
              uStack_308 = uStack_788;
              pGVar15 = (context->scene->geometries).items[(uint)local_860._4_4_].ptr;
              local_520 = local_380;
              if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                bVar99 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar99 = 1, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar134 = vandps_avx(auVar134,auVar174);
                fVar146 = (float)local_340;
                auVar165 = ZEXT3264(CONCAT428(fVar146,CONCAT424(fVar146,CONCAT420(fVar146,CONCAT416(
                                                  fVar146,CONCAT412(fVar146,CONCAT48(fVar146,
                                                  CONCAT44(fVar146,fVar146))))))));
                local_2c0[0] = (fVar146 + auVar206._0_4_ + 0.0) * local_140;
                local_2c0[1] = (fVar146 + auVar206._4_4_ + 1.0) * fStack_13c;
                local_2c0[2] = (fVar146 + auVar206._8_4_ + 2.0) * fStack_138;
                local_2c0[3] = (fVar146 + auVar206._12_4_ + 3.0) * fStack_134;
                fStack_2b0 = (fVar146 + auVar206._16_4_ + 4.0) * fStack_130;
                fStack_2ac = (fVar146 + auVar206._20_4_ + 5.0) * fStack_12c;
                fStack_2a8 = (fVar146 + auVar206._24_4_ + 6.0) * fStack_128;
                fStack_2a4 = fVar146 + auVar206._28_4_ + 7.0;
                local_520._0_8_ = auVar8._0_8_;
                local_520._8_8_ = auVar8._8_8_;
                local_2a0 = local_520._0_8_;
                uStack_298 = local_520._8_8_;
                uStack_290 = 0;
                uStack_288 = 0;
                local_280 = auVar120;
                uVar105 = vmovmskps_avx(auVar134);
                if (uVar105 == 0) {
                  bVar99 = 0;
LAB_018df51e:
                  auVar206 = ZEXT3264(local_720);
                  auVar214 = ZEXT3264(auVar120);
                  auVar191 = ZEXT3264(CONCAT428(fVar166,CONCAT424(fVar144,CONCAT420(fVar166,
                                                  CONCAT416(fVar144,CONCAT412(fVar166,CONCAT48(
                                                  fVar144,uVar110)))))));
                  auVar194 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,
                                                  CONCAT416(fVar209,CONCAT412(fVar209,CONCAT48(
                                                  fVar209,CONCAT44(fVar209,fVar209))))))));
                }
                else {
                  uVar102 = (ulong)(uVar105 & 0xff);
                  local_940 = ZEXT1632(CONCAT88(auVar22._8_8_,uVar102));
                  lVar17 = 0;
                  for (; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
                    lVar17 = lVar17 + 1;
                  }
                  _local_960 = ZEXT1632(CONCAT88(auVar21._8_8_,lVar17));
                  uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
                  _local_460 = *pauVar2;
                  local_3a0 = local_720;
                  local_360 = auVar120;
                  local_33c = iVar101;
                  do {
                    local_200 = local_2c0[(long)local_960];
                    local_1e0 = *(undefined4 *)((long)&local_2a0 + (long)local_960 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_280 + (long)local_960 * 4);
                    fVar124 = 1.0 - local_200;
                    auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar124 * fVar124)),
                                              ZEXT416((uint)(local_200 * fVar124)),
                                              ZEXT416(0xc0000000));
                    auVar21 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar124)),
                                              ZEXT416((uint)(local_200 * local_200)),
                                              ZEXT416(0x40000000));
                    fVar146 = auVar21._0_4_ * 3.0;
                    fVar145 = local_200 * local_200 * 3.0;
                    auVar180._0_4_ = fVar145 * (float)local_660._0_4_;
                    auVar180._4_4_ = fVar145 * (float)local_660._4_4_;
                    auVar180._8_4_ = fVar145 * fStack_658;
                    auVar180._12_4_ = fVar145 * fStack_654;
                    auVar153._4_4_ = fVar146;
                    auVar153._0_4_ = fVar146;
                    auVar153._8_4_ = fVar146;
                    auVar153._12_4_ = fVar146;
                    auVar21 = vfmadd132ps_fma(auVar153,auVar180,auVar11);
                    fVar146 = auVar22._0_4_ * 3.0;
                    auVar176._4_4_ = fVar146;
                    auVar176._0_4_ = fVar146;
                    auVar176._8_4_ = fVar146;
                    auVar176._12_4_ = fVar146;
                    auVar21 = vfmadd132ps_fma(auVar176,auVar21,auVar132);
                    fVar146 = fVar124 * fVar124 * -3.0;
                    local_750.context = context->user;
                    auVar154._4_4_ = fVar146;
                    auVar154._0_4_ = fVar146;
                    auVar154._8_4_ = fVar146;
                    auVar154._12_4_ = fVar146;
                    auVar22 = vfmadd132ps_fma(auVar154,auVar21,auVar12);
                    local_260 = auVar22._0_4_;
                    uStack_25c = local_260;
                    uStack_258 = local_260;
                    uStack_254 = local_260;
                    uStack_250 = local_260;
                    uStack_24c = local_260;
                    uStack_248 = local_260;
                    uStack_244 = local_260;
                    auVar21 = vmovshdup_avx(auVar22);
                    local_240 = auVar21._0_8_;
                    uStack_238 = local_240;
                    uStack_230 = local_240;
                    uStack_228 = local_240;
                    auVar21 = vshufps_avx(auVar22,auVar22,0xaa);
                    auVar155._0_8_ = auVar21._0_8_;
                    auVar155._8_8_ = auVar155._0_8_;
                    local_220._16_8_ = auVar155._0_8_;
                    local_220._0_16_ = auVar155;
                    local_220._24_8_ = auVar155._0_8_;
                    auVar165 = ZEXT3264(local_220);
                    fStack_1fc = local_200;
                    fStack_1f8 = local_200;
                    fStack_1f4 = local_200;
                    fStack_1f0 = local_200;
                    fStack_1ec = local_200;
                    fStack_1e8 = local_200;
                    fStack_1e4 = local_200;
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = local_5e0;
                    uStack_1b8 = CONCAT44(uStack_5d4,uStack_5d8);
                    uStack_1b0 = CONCAT44(uStack_5cc,uStack_5d0);
                    uStack_1a8 = CONCAT44(uStack_5c4,uStack_5c8);
                    local_1a0._4_4_ = uStack_5bc;
                    local_1a0._0_4_ = local_5c0;
                    local_1a0._8_4_ = uStack_5b8;
                    local_1a0._12_4_ = uStack_5b4;
                    local_1a0._16_4_ = uStack_5b0;
                    local_1a0._20_4_ = uStack_5ac;
                    local_1a0._24_4_ = uStack_5a8;
                    local_1a0._28_4_ = uStack_5a4;
                    vpcmpeqd_avx2(local_1a0,local_1a0);
                    local_180 = (local_750.context)->instID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_160 = (local_750.context)->instPrimID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_680 = local_3e0;
                    local_750.valid = (int *)local_680;
                    local_750.geometryUserPtr = pGVar15->userPtr;
                    local_750.hit = (RTCHitN *)&local_260;
                    local_750.N = 8;
                    local_750.ray = (RTCRayN *)ray;
                    if (pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar165 = ZEXT1664(auVar155);
                      (*pGVar15->occlusionFilterN)(&local_750);
                    }
                    auVar135 = vpcmpeqd_avx2(local_680,_DAT_01faff00);
                    auVar134 = _DAT_01fe9960 & ~auVar135;
                    if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar134 >> 0x7f,0) == '\0') &&
                          (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar134 >> 0xbf,0) == '\0') &&
                        (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar134[0x1f]) {
                      auVar135 = auVar135 ^ _DAT_01fe9960;
                    }
                    else {
                      p_Var19 = context->args->filter;
                      if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var19)(&local_750);
                      }
                      auVar134 = vpcmpeqd_avx2(local_680,_DAT_01faff00);
                      auVar135 = auVar134 ^ _DAT_01fe9960;
                      auVar164._8_4_ = 0xff800000;
                      auVar164._0_8_ = 0xff800000ff800000;
                      auVar164._12_4_ = 0xff800000;
                      auVar164._16_4_ = 0xff800000;
                      auVar164._20_4_ = 0xff800000;
                      auVar164._24_4_ = 0xff800000;
                      auVar164._28_4_ = 0xff800000;
                      auVar165 = ZEXT3264(auVar164);
                      auVar134 = vblendvps_avx(auVar164,*(undefined1 (*) [32])
                                                         (local_750.ray + 0x100),auVar134);
                      *(undefined1 (*) [32])(local_750.ray + 0x100) = auVar134;
                    }
                    if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar135 >> 0x7f,0) != '\0') ||
                          (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar135 >> 0xbf,0) != '\0') ||
                        (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar135[0x1f] < '\0') {
                      bVar99 = 1;
                      goto LAB_018df51e;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar109;
                    uVar104 = local_940._0_8_ ^ 1L << ((ulong)local_960 & 0x3f);
                    bVar99 = 0;
                    local_940._0_8_ = uVar104;
                    lVar17 = 0;
                    for (uVar102 = uVar104; (uVar102 & 1) == 0;
                        uVar102 = uVar102 >> 1 | 0x8000000000000000) {
                      lVar17 = lVar17 + 1;
                    }
                    local_960 = (undefined1  [8])lVar17;
                    auVar206 = ZEXT3264(local_720);
                    auVar214 = ZEXT3264(auVar120);
                    auVar191 = ZEXT3264(CONCAT428(fVar166,CONCAT424(fVar144,CONCAT420(fVar166,
                                                  CONCAT416(fVar144,CONCAT412(fVar166,CONCAT48(
                                                  fVar144,uVar110)))))));
                    auVar194 = ZEXT3264(CONCAT428(fVar209,CONCAT424(fVar209,CONCAT420(fVar209,
                                                  CONCAT416(fVar209,CONCAT412(fVar209,CONCAT48(
                                                  fVar209,CONCAT44(fVar209,fVar209))))))));
                  } while (uVar104 != 0);
                }
              }
              bVar106 = (bool)(bVar106 | bVar99);
            }
          }
          local_720 = auVar206._0_32_;
          local_920 = auVar214._0_32_;
          lVar108 = lVar108 + 8;
          auVar6._8_8_ = uStack_5f8;
          auVar6._0_8_ = local_600;
          auVar6._16_8_ = uStack_5f0;
          auVar6._24_8_ = uStack_5e8;
        } while ((int)lVar108 < iVar101);
      }
      if (bVar106) {
        return bVar106;
      }
      uVar109 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar121._4_4_ = uVar109;
      auVar121._0_4_ = uVar109;
      auVar121._8_4_ = uVar109;
      auVar121._12_4_ = uVar109;
      auVar121._16_4_ = uVar109;
      auVar121._20_4_ = uVar109;
      auVar121._24_4_ = uVar109;
      auVar121._28_4_ = uVar109;
      auVar134 = vcmpps_avx(local_80,auVar121,2);
      uVar105 = vmovmskps_avx(auVar134);
      uVar100 = uVar100 & uVar100 + 0xff & uVar105;
    } while (uVar100 != 0);
  }
  return bVar106;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }